

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O0

int av1_optimize_txb(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type
                    ,TXB_CTX *txb_ctx,int *rate_cost,int sharpness)

{
  tran_low_t tcoeff_00;
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  byte bVar7;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  byte in_R9B;
  bool bVar8;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int in_stack_00000018;
  int tx_type_cost;
  int64_t dummy_dist;
  int64_t dist0;
  int64_t dist;
  tran_low_t dqc;
  tran_low_t tqc;
  int coeff_ctx;
  int nz_ci [3];
  int nz_num;
  int max_nz_num;
  int sign;
  tran_low_t abs_qc;
  tran_low_t qc;
  int ci;
  int si;
  int64_t accu_dist;
  int accu_rate;
  int eob_cost;
  int skip_cost;
  int non_skip_cost;
  uint8_t *levels;
  uint8_t levels_buf [1312];
  int64_t rdmult;
  int rshift;
  LV_MAP_EOB_COST *txb_eob_costs;
  int eob_multi_size;
  LV_MAP_COEFF_COST *txb_costs;
  int is_inter;
  int height;
  int width;
  int bhl;
  MB_MODE_INFO *mbmi;
  TX_CLASS tx_class;
  TX_SIZE txs_ctx;
  PLANE_TYPE plane_type;
  AV1_COMMON *cm;
  CoeffCosts *coeff_costs;
  tran_low_t *tcoeff;
  tran_low_t *dqcoeff;
  tran_low_t *qcoeff;
  int block_offset;
  qm_val_t *qmatrix;
  qm_val_t *iqmatrix;
  int16_t *dequant;
  int eob;
  int shift;
  int16_t *scan;
  SCAN_ORDER *scan_order;
  macroblock_plane *p;
  MACROBLOCKD *xd;
  int last_ci_2;
  int ni_2;
  int allow_lower_qc_2;
  int qc_threshold_2;
  int64_t rd_new_eob_low_2;
  int64_t dist_new_eob_low_2;
  int rate_coeff_eob_low_2;
  int64_t rd_new_eob_2;
  int64_t dist_new_eob_2;
  int rate_coeff_eob_2;
  int new_eob_cost_2;
  int coeff_ctx_new_eob_2;
  int new_eob_2;
  int lower_level_new_eob_2;
  int rate_low_2;
  int64_t rd_low_2;
  int64_t dist_low_2;
  tran_low_t abs_qc_low_2;
  tran_low_t dqc_low_2;
  tran_low_t qc_low_2;
  int64_t rd_2;
  int rate_2;
  int64_t dist_3;
  int64_t dist0_3;
  int sign_3;
  tran_low_t dqc_3;
  tran_low_t tqc_3;
  tran_low_t abs_qc_3;
  int lower_level_2;
  int coeff_ctx_3;
  tran_low_t qc_3;
  int ci_3;
  int dqv_2;
  int last_ci_1;
  int ni_1;
  int allow_lower_qc_1;
  int qc_threshold_1;
  int64_t rd_new_eob_low_1;
  int64_t dist_new_eob_low_1;
  int rate_coeff_eob_low_1;
  int64_t rd_new_eob_1;
  int64_t dist_new_eob_1;
  int rate_coeff_eob_1;
  int new_eob_cost_1;
  int coeff_ctx_new_eob_1;
  int new_eob_1;
  int lower_level_new_eob_1;
  int rate_low_1;
  int64_t rd_low_1;
  int64_t dist_low_1;
  tran_low_t abs_qc_low_1;
  tran_low_t dqc_low_1;
  tran_low_t qc_low_1;
  int64_t rd_1;
  int rate_1;
  int64_t dist_2;
  int64_t dist0_2;
  int sign_2;
  tran_low_t dqc_2;
  tran_low_t tqc_2;
  tran_low_t abs_qc_2;
  int lower_level_1;
  int coeff_ctx_2;
  tran_low_t qc_2;
  int ci_2;
  int dqv_1;
  int last_ci;
  int ni;
  int allow_lower_qc;
  int qc_threshold;
  int64_t rd_new_eob_low;
  int64_t dist_new_eob_low;
  int rate_coeff_eob_low;
  int64_t rd_new_eob;
  int64_t dist_new_eob;
  int rate_coeff_eob;
  int new_eob_cost;
  int coeff_ctx_new_eob;
  int new_eob;
  int lower_level_new_eob;
  int rate_low;
  int64_t rd_low;
  int64_t dist_low;
  tran_low_t abs_qc_low;
  tran_low_t dqc_low;
  tran_low_t qc_low;
  int64_t rd;
  int rate;
  int64_t dist_1;
  int64_t dist0_1;
  int sign_1;
  tran_low_t dqc_1;
  tran_low_t tqc_1;
  tran_low_t abs_qc_1;
  int lower_level;
  int coeff_ctx_1;
  tran_low_t qc_1;
  int ci_1;
  int dqv;
  int sign_6;
  int allow_lower_qc_5;
  int64_t rd_low_5;
  int64_t dist_low_5;
  tran_low_t abs_dqc_low_2;
  tran_low_t abs_qc_low_5;
  int64_t rd_5;
  int64_t dist_6;
  int rate_5;
  int rate_low_5;
  tran_low_t abs_dqc_2;
  tran_low_t abs_tqc_2;
  tran_low_t abs_qc_6;
  int coeff_ctx_6;
  tran_low_t qc_6;
  int ci_6;
  int dqv_5;
  int sign_5;
  int allow_lower_qc_4;
  int64_t rd_low_4;
  int64_t dist_low_4;
  tran_low_t abs_dqc_low_1;
  tran_low_t abs_qc_low_4;
  int64_t rd_4;
  int64_t dist_5;
  int rate_4;
  int rate_low_4;
  tran_low_t abs_dqc_1;
  tran_low_t abs_tqc_1;
  tran_low_t abs_qc_5;
  int coeff_ctx_5;
  tran_low_t qc_5;
  int ci_5;
  int dqv_4;
  int sign_4;
  int allow_lower_qc_3;
  int64_t rd_low_3;
  int64_t dist_low_3;
  tran_low_t abs_dqc_low;
  tran_low_t abs_qc_low_3;
  int64_t rd_3;
  int64_t dist_4;
  int rate_3;
  int rate_low_3;
  tran_low_t abs_dqc;
  tran_low_t abs_tqc;
  tran_low_t abs_qc_4;
  int coeff_ctx_4;
  tran_low_t qc_4;
  int ci_4;
  int dqv_3;
  int stats_3;
  int stats_4;
  int stats_5;
  int stats;
  int stats_1;
  int stats_2;
  int mag_2;
  int mag_1;
  int mag;
  int mag_7;
  int mag_5;
  int mag_3;
  int row_2;
  int col_5;
  int col_4;
  int ctx_2;
  int row_1;
  int col_3;
  int col_2;
  int ctx_1;
  int row;
  int col_1;
  int col;
  int ctx;
  int row_7;
  int col_13;
  int col_12;
  int ctx_5;
  int row_5;
  int col_10;
  int col_9;
  int ctx_4;
  int row_3;
  int col_7;
  int col_6;
  int ctx_3;
  int brcost_diff;
  int br_ctx;
  int diff;
  int cost;
  int mag_4;
  int pos;
  int stride;
  int row_4;
  int col_8;
  int brcost_diff_1;
  int br_ctx_1;
  int diff_1;
  int cost_1;
  int mag_6;
  int pos_1;
  int stride_1;
  int row_6;
  int col_11;
  int brcost_diff_2;
  int br_ctx_2;
  int diff_2;
  int cost_2;
  int mag_8;
  int pos_2;
  int stride_2;
  int row_8;
  int col_14;
  undefined4 in_stack_ffffffffffffec80;
  undefined4 in_stack_ffffffffffffec84;
  int *in_stack_ffffffffffffec88;
  undefined4 uVar10;
  int *piVar9;
  int iVar11;
  LV_MAP_COEFF_COST *in_stack_ffffffffffffec90;
  undefined2 in_stack_ffffffffffffec98;
  TX_TYPE in_stack_ffffffffffffec9a;
  undefined4 in_stack_ffffffffffffec9b;
  TX_CLASS in_stack_ffffffffffffec9f;
  CommonQuantParams *in_stack_ffffffffffffeca0;
  MACROBLOCK *in_stack_ffffffffffffeca8;
  long in_stack_ffffffffffffecb0;
  long in_stack_ffffffffffffecb8;
  LV_MAP_COEFF_COST *in_stack_ffffffffffffecd0;
  qm_val_t *in_stack_ffffffffffffecd8;
  LV_MAP_COEFF_COST *in_stack_ffffffffffffed10;
  LV_MAP_COEFF_COST *pLVar12;
  int in_stack_ffffffffffffed18;
  uint8_t local_12e4;
  undefined4 in_stack_ffffffffffffed20;
  int in_stack_ffffffffffffed24;
  undefined2 uVar13;
  int in_stack_ffffffffffffed28;
  int in_stack_ffffffffffffed2c;
  uint in_stack_ffffffffffffed30;
  int in_stack_ffffffffffffed34;
  int *in_stack_ffffffffffffed38;
  uint local_12b8;
  qm_val_t *in_stack_ffffffffffffed50;
  LV_MAP_COEFF_COST *in_stack_ffffffffffffed58;
  undefined7 in_stack_ffffffffffffed60;
  uint8_t in_stack_ffffffffffffed67;
  int shift_00;
  LV_MAP_COEFF_COST *in_stack_ffffffffffffed68;
  int in_stack_ffffffffffffed70;
  uint8_t local_128c;
  uint in_stack_ffffffffffffed78;
  int in_stack_ffffffffffffed7c;
  int in_stack_ffffffffffffed80;
  int in_stack_ffffffffffffed84;
  uint in_stack_ffffffffffffed88;
  int in_stack_ffffffffffffed8c;
  tran_low_t *in_stack_ffffffffffffed90;
  undefined4 in_stack_ffffffffffffed98;
  uint in_stack_ffffffffffffed9c;
  uint in_stack_ffffffffffffeda0;
  int in_stack_ffffffffffffeda4;
  qm_val_t *in_stack_ffffffffffffeda8;
  LV_MAP_COEFF_COST *in_stack_ffffffffffffedb0;
  undefined7 in_stack_ffffffffffffedb8;
  uint8_t in_stack_ffffffffffffedbf;
  uint8_t local_1234;
  uint local_1230;
  int local_122c;
  int local_1228;
  int local_1224;
  int local_121c;
  uint local_1208;
  uint8_t local_11dc;
  uint local_11cc;
  uint local_11bc;
  uint8_t local_117c;
  uint local_116c;
  uint local_115c;
  uint8_t local_111c;
  uint local_110c;
  uint local_10fc;
  qm_val_t *local_10a0;
  int local_1050 [6];
  int local_1038;
  int local_1034;
  int local_1030;
  int local_102c;
  long local_1028;
  int local_1020;
  int local_101c;
  int local_1018;
  uint local_1014;
  LV_MAP_COEFF_COST *local_1010;
  uint8_t local_1008 [1320];
  int *local_ae0;
  undefined4 local_ad4;
  long local_ad0;
  int local_ac4;
  long local_ac0;
  int local_ab8;
  int local_ab4;
  uint local_ab0;
  int local_aac;
  undefined8 local_aa8;
  byte local_a9b;
  byte local_a9a;
  byte local_a99;
  long local_a98;
  long local_a90;
  long local_a88;
  LV_MAP_COEFF_COST *local_a80;
  tran_low_t *local_a78;
  int local_a6c;
  qm_val_t *local_a68;
  qm_val_t *local_a60;
  CommonQuantParams *local_a58;
  uint local_a50;
  int local_a4c;
  MACROBLOCK *local_a48;
  SCAN_ORDER *local_a40;
  long local_a38;
  long local_a30;
  byte local_a22;
  byte local_a21;
  int local_a20;
  int local_a1c;
  long local_a18;
  long local_a10;
  int local_a08;
  int local_a04;
  uint local_a00;
  int local_9fc;
  long local_9f8;
  long local_9f0;
  int local_9e4;
  long local_9e0;
  long local_9d8;
  int local_9d0;
  int local_9cc;
  int local_9c8;
  uint local_9c4;
  int local_9c0;
  int local_9bc;
  long local_9b8;
  long local_9b0;
  int local_9a4;
  tran_low_t local_9a0;
  tran_low_t local_99c;
  long local_998;
  int local_98c;
  long local_988;
  long local_980;
  uint local_974;
  tran_low_t local_970;
  tran_low_t local_96c;
  int local_968;
  int local_964;
  int local_960;
  int local_95c;
  int local_958;
  int local_954;
  qm_val_t *local_950;
  qm_val_t *local_948;
  int local_93c;
  LV_MAP_COEFF_COST *local_938;
  LV_MAP_COEFF_COST *local_930;
  tran_low_t *local_928;
  long local_920;
  long local_918;
  long local_910;
  MACROBLOCK *local_908;
  CommonQuantParams *local_900;
  int local_8f4;
  int *local_8f0;
  int local_8e4;
  uint local_8e0;
  int local_8dc;
  byte local_8d6;
  byte local_8d5;
  int local_8d4;
  int *local_8d0;
  int *local_8c8;
  uint *local_8c0;
  long *local_8b8;
  int *local_8b0;
  int local_8a8;
  int local_8a4;
  uint local_8a0;
  int local_89c;
  long local_898;
  long local_890;
  int local_884;
  long local_880;
  long local_878;
  int local_870;
  int local_86c;
  int local_868;
  uint local_864;
  int local_860;
  int local_85c;
  long local_858;
  long local_850;
  int local_844;
  tran_low_t local_840;
  tran_low_t local_83c;
  long local_838;
  int local_82c;
  long local_828;
  long local_820;
  uint local_814;
  tran_low_t local_810;
  tran_low_t local_80c;
  int local_808;
  int local_804;
  int local_800;
  int local_7fc;
  int local_7f8;
  int local_7f4;
  qm_val_t *local_7f0;
  qm_val_t *local_7e8;
  int local_7dc;
  LV_MAP_COEFF_COST *local_7d8;
  LV_MAP_COEFF_COST *local_7d0;
  tran_low_t *local_7c8;
  long local_7c0;
  long local_7b8;
  long local_7b0;
  MACROBLOCK *local_7a8;
  CommonQuantParams *local_7a0;
  int local_794;
  int *local_790;
  int local_784;
  uint local_780;
  int local_77c;
  byte local_776;
  byte local_775;
  int local_774;
  int *local_770;
  int *local_768;
  uint *local_760;
  long *local_758;
  int *local_750;
  int local_748;
  int local_744;
  uint local_740;
  int local_73c;
  long local_738;
  long local_730;
  int local_724;
  long local_720;
  long local_718;
  int local_710;
  int local_70c;
  int local_708;
  uint local_704;
  int local_700;
  int local_6fc;
  long local_6f8;
  long local_6f0;
  int local_6e4;
  tran_low_t local_6e0;
  tran_low_t local_6dc;
  long local_6d8;
  int local_6cc;
  long local_6c8;
  long local_6c0;
  uint local_6b4;
  tran_low_t local_6b0;
  tran_low_t local_6ac;
  int local_6a8;
  int local_6a4;
  int local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  qm_val_t *local_690;
  qm_val_t *local_688;
  int local_67c;
  LV_MAP_COEFF_COST *local_678;
  LV_MAP_COEFF_COST *local_670;
  tran_low_t *local_668;
  long local_660;
  long local_658;
  long local_650;
  MACROBLOCK *local_648;
  CommonQuantParams *local_640;
  int local_634;
  int *local_630;
  int local_624;
  uint local_620;
  int local_61c;
  byte local_616;
  byte local_615;
  int local_614;
  int *local_610;
  int *local_608;
  uint *local_600;
  long *local_5f8;
  int *local_5f0;
  uint local_5e8;
  uint local_5e4;
  long local_5e0;
  int64_t local_5d8;
  uint local_5d0;
  uint local_5cc;
  long local_5c8;
  int64_t local_5c0;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  qm_val_t *local_590;
  qm_val_t *local_588;
  int local_57c;
  LV_MAP_COEFF_COST *local_578;
  LV_MAP_COEFF_COST *local_570;
  tran_low_t *local_568;
  long local_560;
  long local_558;
  MACROBLOCK *local_550;
  CommonQuantParams *local_548;
  int local_53c;
  int *local_538;
  int local_530;
  byte local_52a;
  byte local_529;
  uint local_528;
  int local_524;
  int *local_520;
  uint local_518;
  uint local_514;
  long local_510;
  int64_t local_508;
  uint local_500;
  uint local_4fc;
  long local_4f8;
  int64_t local_4f0;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  qm_val_t *local_4c0;
  qm_val_t *local_4b8;
  int local_4ac;
  LV_MAP_COEFF_COST *local_4a8;
  LV_MAP_COEFF_COST *local_4a0;
  tran_low_t *local_498;
  long local_490;
  long local_488;
  MACROBLOCK *local_480;
  CommonQuantParams *local_478;
  int local_46c;
  int *local_468;
  int local_460;
  byte local_45a;
  byte local_459;
  uint local_458;
  int local_454;
  int *local_450;
  uint local_448;
  uint local_444;
  long local_440;
  int64_t local_438;
  uint local_430;
  uint local_42c;
  long local_428;
  int64_t local_420;
  int local_414;
  int local_410;
  int local_40c;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  qm_val_t *local_3f0;
  qm_val_t *local_3e8;
  int local_3dc;
  LV_MAP_COEFF_COST *local_3d8;
  LV_MAP_COEFF_COST *local_3d0;
  tran_low_t *local_3c8;
  long local_3c0;
  long local_3b8;
  MACROBLOCK *local_3b0;
  CommonQuantParams *local_3a8;
  int local_39c;
  int *local_398;
  int local_390;
  char local_38a;
  byte local_389;
  uint local_388;
  int local_384;
  int *local_380;
  int local_378;
  char local_372;
  byte local_371;
  int local_370;
  int local_36c;
  LV_MAP_COEFF_COST *local_368;
  int local_360;
  byte local_35a;
  byte local_359;
  int local_358;
  int local_354;
  LV_MAP_COEFF_COST *local_350;
  int local_348;
  byte local_342;
  byte local_341;
  int local_340;
  int local_33c;
  LV_MAP_COEFF_COST *local_338;
  int local_330;
  byte local_32a;
  byte local_329;
  int local_328;
  int local_324;
  LV_MAP_COEFF_COST *local_320;
  int local_318;
  byte local_312;
  byte local_311;
  int local_310;
  int local_30c;
  LV_MAP_COEFF_COST *local_308;
  int local_300;
  byte local_2fa;
  byte local_2f9;
  int local_2f8;
  int local_2f4;
  LV_MAP_COEFF_COST *local_2f0;
  int local_2e4;
  byte local_2dd;
  int local_2dc;
  uint8_t *local_2d8;
  int local_2cc;
  byte local_2c5;
  int local_2c4;
  uint8_t *local_2c0;
  int local_2b4;
  byte local_2ad;
  int local_2ac;
  uint8_t *local_2a8;
  int local_29c;
  byte local_295;
  int local_294;
  uint8_t *local_290;
  int local_284;
  byte local_27d;
  int local_27c;
  uint8_t *local_278;
  int local_26c;
  char local_265;
  int local_264;
  uint8_t *local_260;
  int local_258;
  int local_254;
  int local_250;
  uint local_24c;
  byte local_246;
  byte local_245;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  uint local_228;
  byte local_222;
  byte local_221;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  uint local_204;
  byte local_1fe;
  byte local_1fd;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  uint local_1e0;
  byte local_1da;
  byte local_1d9;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  uint local_1bc;
  byte local_1b6;
  byte local_1b5;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  uint local_198;
  char local_192;
  byte local_191;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int *local_170;
  LV_MAP_COEFF_COST *local_168;
  char local_15d;
  int local_15c;
  long local_158;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  char local_129;
  int local_128;
  int local_124;
  LV_MAP_COEFF_COST *local_120;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int *local_100;
  LV_MAP_COEFF_COST *local_f8;
  byte local_ed;
  int local_ec;
  long local_e8;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  byte local_b9;
  int local_b8;
  int local_b4;
  LV_MAP_COEFF_COST *local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int *local_90;
  LV_MAP_COEFF_COST *local_88;
  byte local_7d;
  int local_7c;
  long local_78;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  byte local_49;
  int local_48;
  int local_44;
  LV_MAP_COEFF_COST *local_40;
  int local_34;
  
  local_a30 = in_RSI + 0x1a0;
  local_a38 = in_RSI + (long)in_EDX * 0x88;
  local_a22 = in_R9B;
  local_a21 = in_R8B;
  local_a20 = in_ECX;
  local_a1c = in_EDX;
  local_a18 = in_RSI;
  local_a10 = in_RDI;
  local_a40 = get_scan('\0','\0');
  local_a48 = (MACROBLOCK *)local_a40->scan;
  local_a4c = av1_get_tx_scale(local_a21);
  local_a50 = (uint)*(ushort *)(*(long *)(local_a38 + 0x20) + (long)local_a20 * 2);
  local_a58 = *(CommonQuantParams **)(local_a38 + 0x80);
  local_a60 = av1_get_iqmatrix(in_stack_ffffffffffffeca0,
                               (MACROBLOCKD *)
                               CONCAT17(in_stack_ffffffffffffec9f,
                                        CONCAT43(in_stack_ffffffffffffec9b,
                                                 CONCAT12(in_stack_ffffffffffffec9a,
                                                          in_stack_ffffffffffffec98))),
                               (int)((ulong)in_stack_ffffffffffffec90 >> 0x20),
                               (TX_SIZE)((ulong)in_stack_ffffffffffffec90 >> 0x18),
                               (TX_TYPE)((ulong)in_stack_ffffffffffffec90 >> 0x10));
  if (*(int *)(local_a10 + 0x426a4) == 1) {
    local_10a0 = av1_get_qmatrix(in_stack_ffffffffffffeca0,
                                 (MACROBLOCKD *)
                                 CONCAT17(in_stack_ffffffffffffec9f,
                                          CONCAT43(in_stack_ffffffffffffec9b,
                                                   CONCAT12(in_stack_ffffffffffffec9a,
                                                            in_stack_ffffffffffffec98))),
                                 (int)((ulong)in_stack_ffffffffffffec90 >> 0x20),
                                 (TX_SIZE)((ulong)in_stack_ffffffffffffec90 >> 0x18),
                                 (TX_TYPE)((ulong)in_stack_ffffffffffffec90 >> 0x10));
    local_128c = in_stack_ffffffffffffed67;
    local_1234 = in_stack_ffffffffffffedbf;
  }
  else {
    local_10a0 = (qm_val_t *)0x0;
    local_128c = in_stack_ffffffffffffed67;
    local_1234 = in_stack_ffffffffffffedbf;
  }
  local_a68 = local_10a0;
  local_a6c = local_a20 << 4;
  local_a78 = (tran_low_t *)(*(long *)(local_a38 + 0x10) + (long)local_a6c * 4);
  local_a80 = (LV_MAP_COEFF_COST *)(*(long *)(local_a38 + 8) + (long)local_a6c * 4);
  local_a88 = *(long *)(local_a38 + 0x18) + (long)local_a6c * 4;
  local_a90 = local_a18 + 0xb9d8;
  local_a98 = local_a10 + 0x3bf80;
  local_a99 = get_plane_type(local_a1c);
  local_a9a = get_txsize_entropy_ctx(local_a21);
  local_a9b = ""[local_a22];
  local_aa8 = **(undefined8 **)(local_a30 + 0x1eb8);
  local_aac = get_txb_bhl('\0');
  local_ab0 = get_txb_wide('\0');
  local_ab4 = get_txb_high('\0');
  local_ab8 = is_inter_block((MB_MODE_INFO *)
                             CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
  local_ac0 = local_a90 + (ulong)local_a9a * 0x1d80 + (ulong)local_a99 * 0xec0;
  local_ac4 = (int)""[local_a21];
  local_ad0 = local_a90 + 0x9380 + (long)local_ac4 * 0xb0 + (ulong)local_a99 * 0x58;
  bVar8 = true;
  if (*(int *)(local_a10 + 0x42698) != 10) {
    bVar8 = *(int *)(local_a10 + 0x42698) == 0xb;
  }
  local_ad4 = 5;
  if (bVar8) {
    local_ad4 = 7;
  }
  local_ae0 = (int *)((long)*(int *)(local_a18 + 0x4218) * (long)(8 - in_stack_00000018) *
                      (long)(plane_rd_mult[local_ab8][local_a99] <<
                            (((char)*(undefined4 *)(local_a30 + 0x29a0) + -8) * '\x02' & 0x1fU)) +
                      (long)((1 << (sbyte)local_ad4) >> 1) >> (sbyte)local_ad4);
  local_1010 = (LV_MAP_COEFF_COST *)set_levels(local_1008,local_ab4);
  if (1 < (int)local_a50) {
    (*av1_txb_init_levels)(local_a78,local_ab0,local_ab4,(uint8_t *)local_1010);
  }
  local_1014 = *(uint *)(local_ac0 + (long)*in_stack_00000008 * 8);
  local_1018 = *(int *)(local_ac0 + 4 + (long)*in_stack_00000008 * 8);
  local_1020 = get_eob_cost((int)((ulong)in_stack_ffffffffffffecb0 >> 0x20),
                            (LV_MAP_EOB_COST *)in_stack_ffffffffffffeca8,
                            (LV_MAP_COEFF_COST *)in_stack_ffffffffffffeca0,in_stack_ffffffffffffec9f
                           );
  local_1028 = 0;
  local_102c = local_a50 - 1;
  local_1050[0] = (int)*(short *)((long)&local_a48->plane[0].src_diff + (long)local_102c * 2);
  local_1034 = local_a78[local_1050[0]];
  local_1038 = local_1034;
  if (local_1034 < 1) {
    local_1038 = -local_1034;
  }
  local_1050[5] = (int)(local_1034 < 0);
  local_1050[4] = 2;
  local_1050[3] = 1;
  local_1050[1] = 0;
  local_1050[2] = 0;
  local_1030 = local_1050[0];
  local_101c = local_1020;
  if (local_1038 < 2) {
    get_lower_levels_ctx_eob(local_aac,local_ab0,local_102c);
    uVar2 = (uint)local_a9b;
    iVar3 = get_coeff_cost_eob((int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                               (tran_low_t)in_stack_ffffffffffffeca8,
                               (int)((ulong)in_stack_ffffffffffffeca0 >> 0x20),
                               (int)in_stack_ffffffffffffeca0,
                               CONCAT13(in_stack_ffffffffffffec9f,
                                        (int3)((uint)in_stack_ffffffffffffec9b >> 8)),
                               in_stack_ffffffffffffec90,(int)in_stack_ffffffffffffecd0,
                               (TX_CLASS)in_stack_ffffffffffffecd8);
    local_1020 = iVar3 + local_1020;
    tcoeff_00 = *(tran_low_t *)(local_a88 + (long)local_1030 * 4);
    iVar6 = get_coeff_dist(tcoeff_00,local_a80->txb_skip_cost[0][local_1030],local_a4c,local_a68,
                           local_1030);
    iVar5 = get_coeff_dist(tcoeff_00,0,local_a4c,local_a68,local_1030);
    local_1028 = (iVar6 - iVar5) + local_1028;
  }
  else {
    iVar3 = in_stack_00000008[1];
    in_stack_ffffffffffffec90 =
         (LV_MAP_COEFF_COST *)CONCAT44((int)((ulong)in_stack_ffffffffffffec90 >> 0x20),local_a4c);
    in_stack_ffffffffffffec98 = (undefined2)iVar3;
    in_stack_ffffffffffffec9a = (TX_TYPE)((uint)iVar3 >> 0x10);
    in_stack_ffffffffffffec9b =
         CONCAT31((int3)((uint)in_stack_ffffffffffffec9b >> 8),(char)((uint)iVar3 >> 0x18));
    uVar2 = local_ab0;
    in_stack_ffffffffffffec88 = local_ae0;
    in_stack_ffffffffffffeca0 = local_a58;
    in_stack_ffffffffffffeca8 = local_a48;
    in_stack_ffffffffffffecb0 = local_ac0;
    in_stack_ffffffffffffecb8 = local_a88;
    in_stack_ffffffffffffecd0 = local_1010;
    in_stack_ffffffffffffecd8 = local_a60;
    update_coeff_general
              (in_stack_ffffffffffffed38,
               (int64_t *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
               in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28,
               (TX_SIZE)((uint)in_stack_ffffffffffffed24 >> 0x18),
               (TX_CLASS)((uint)in_stack_ffffffffffffed24 >> 0x10),(int)in_stack_ffffffffffffed50,
               (int)in_stack_ffffffffffffed58,CONCAT17(local_128c,in_stack_ffffffffffffed60),
               (int)in_stack_ffffffffffffed68,in_stack_ffffffffffffed70,
               (int16_t *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
               (int16_t *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
               (LV_MAP_COEFF_COST *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88),
               in_stack_ffffffffffffed90,
               (tran_low_t *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98),
               (tran_low_t *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
               in_stack_ffffffffffffeda8,(qm_val_t *)in_stack_ffffffffffffedb0,
               (qm_val_t *)CONCAT17(local_1234,in_stack_ffffffffffffedb8));
  }
  local_102c = local_102c + -1;
  if (local_a9b == 0) {
    for (; -1 < local_102c && local_1050[3] < 3; local_102c = local_102c + -1) {
      local_610 = local_1050;
      local_624 = in_stack_00000008[1];
      local_5f0 = &local_1020;
      local_5f8 = &local_1028;
      local_600 = &local_a50;
      local_608 = local_1050 + 3;
      local_614 = local_102c;
      local_615 = local_a21;
      local_616 = 0;
      local_61c = local_aac;
      local_620 = local_ab0;
      local_630 = local_ae0;
      local_634 = local_a4c;
      local_640 = local_a58;
      local_648 = local_a48;
      local_650 = local_ad0;
      local_658 = local_ac0;
      local_660 = local_a88;
      local_668 = local_a78;
      local_670 = local_a80;
      local_678 = local_1010;
      local_67c = in_stack_00000018;
      local_688 = local_a60;
      local_690 = local_a68;
      local_694 = get_dqv((int16_t *)local_a58,
                          (int)*(short *)((long)&local_a48->plane[0].src_diff + (long)local_102c * 2
                                         ),local_a60);
      pLVar12 = local_678;
      local_698 = (int)*(short *)((long)&local_648->plane[0].src_diff + (long)local_614 * 2);
      local_69c = local_668[local_698];
      local_320 = local_678;
      local_328 = local_61c;
      local_329 = local_615;
      local_32a = local_616;
      local_324 = local_698;
      iVar3 = get_padded_idx(local_698,local_61c);
      local_2a8 = (uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3);
      local_2ac = local_328;
      local_2ad = local_32a;
      bVar7 = (byte)local_328;
      iVar3 = (uint)""[local_2a8[1]] + (uint)""[local_2a8[(1 << (bVar7 & 0x1f)) + 4]];
      if (local_32a == 0) {
        local_2b4 = (uint)""[local_2a8[2]] +
                    (uint)""[local_2a8[(2 << (bVar7 & 0x1f)) + 8]] +
                    (uint)""[local_2a8[(1 << (bVar7 & 0x1f)) + 5]] + iVar3;
      }
      else if (local_32a == 2) {
        local_2b4 = (uint)""[local_2a8[4]] + (uint)""[local_2a8[3]] + (uint)""[local_2a8[2]] + iVar3
        ;
      }
      else {
        local_2b4 = (uint)""[local_2a8[(4 << (bVar7 & 0x1f)) + 0x10]] +
                    (uint)""[local_2a8[(3 << (bVar7 & 0x1f)) + 0xc]] +
                    (uint)""[local_2a8[(2 << (bVar7 & 0x1f)) + 8]] + iVar3;
      }
      local_330 = local_2b4;
      local_1f4 = local_2b4;
      local_1f8 = local_324;
      local_1fc = local_328;
      local_1fd = local_329;
      local_1fe = local_32a;
      if (local_32a == 0 && local_324 == 0) {
        local_1f0 = 0;
      }
      else {
        local_10fc = local_2b4 + 1 >> 1;
        if (3 < local_10fc) {
          local_10fc = 4;
        }
        local_204 = local_10fc;
        if (local_32a == 0) {
          local_1f0 = local_10fc + (int)av1_nz_map_ctx_offset[local_329][local_324];
        }
        else if (local_32a == 1) {
          local_208 = local_324 >> (bVar7 & 0x1f);
          local_1f0 = local_10fc + nz_map_ctx_offset_1d[local_208];
        }
        else if (local_32a == 2) {
          local_20c = local_324 >> (bVar7 & 0x1f);
          local_210 = local_324 - (local_20c << (bVar7 & 0x1f));
          local_1f0 = local_10fc + nz_map_ctx_offset_1d[local_210];
        }
        else {
          local_1f0 = 0;
        }
      }
      local_6a0 = local_1f0;
      if (local_69c == 0) {
        *local_5f0 = *(int *)(local_658 + 0x98 + (long)local_1f0 * 0x20) + *local_5f0;
      }
      else {
        local_6a4 = 0;
        local_6a8 = local_69c;
        if (local_69c < 1) {
          local_6a8 = -local_69c;
        }
        local_6ac = *(tran_low_t *)(local_660 + (long)local_698 * 4);
        local_6b0 = local_670->txb_skip_cost[0][local_698];
        local_6b4 = (uint)(local_69c < 0);
        local_6c0 = get_coeff_dist(local_6ac,0,local_634,local_690,local_698);
        uVar10 = (undefined4)((ulong)in_stack_ffffffffffffec88 >> 0x20);
        iVar6 = get_coeff_dist(local_6ac,local_6b0,local_634,local_690,local_698);
        local_6c8 = iVar6 - local_6c0;
        in_stack_ffffffffffffec88 = (int *)CONCAT44(uVar10,(uint)local_616);
        in_stack_ffffffffffffec90 = local_678;
        local_6cc = get_coeff_cost_general
                              ((int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
                               (int)in_stack_ffffffffffffecb8,
                               (tran_low_t)((ulong)in_stack_ffffffffffffecb0 >> 0x20),
                               (int)in_stack_ffffffffffffecb0,
                               (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                               (int)in_stack_ffffffffffffeca8,in_stack_ffffffffffffed10,
                               in_stack_ffffffffffffed18,(TX_CLASS)in_stack_ffffffffffffed20,
                               (uint8_t *)
                               CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
        local_6d8 = ((long)(*local_5f0 + local_6cc) * (long)local_630 + 0x100 >> 9) +
                    (*local_5f8 + local_6c8) * 0x80;
        if (local_6a8 == 1) {
          local_6e4 = 0;
          local_6dc = 0;
          local_6e0 = 0;
          local_6f0 = 0;
          local_6fc = *(int *)(local_658 + 0x98 + (long)local_6a0 * 0x20);
          local_6f8 = ((long)(*local_5f0 + local_6fc) * (long)local_630 + 0x100 >> 9) +
                      *local_5f8 * 0x80;
        }
        else {
          get_qc_dqc_low(local_6a8,local_6b4,local_694,local_634,&local_6dc,&local_6e0);
          uVar10 = (undefined4)((ulong)in_stack_ffffffffffffec88 >> 0x20);
          local_6e4 = local_6a8 + -1;
          iVar6 = get_coeff_dist(local_6ac,local_6e0,local_634,local_690,local_698);
          local_6f0 = iVar6 - local_6c0;
          in_stack_ffffffffffffec88 = (int *)CONCAT44(uVar10,(uint)local_616);
          in_stack_ffffffffffffec90 = local_678;
          local_6fc = get_coeff_cost_general
                                ((int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
                                 (int)in_stack_ffffffffffffecb8,
                                 (tran_low_t)((ulong)in_stack_ffffffffffffecb0 >> 0x20),
                                 (int)in_stack_ffffffffffffecb0,
                                 (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                                 (int)in_stack_ffffffffffffeca8,in_stack_ffffffffffffed10,
                                 in_stack_ffffffffffffed18,(TX_CLASS)in_stack_ffffffffffffed20,
                                 (uint8_t *)
                                 CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
          local_6f8 = ((long)(*local_5f0 + local_6fc) * (long)local_630 + 0x100 >> 9) +
                      (*local_5f8 + local_6f0) * 0x80;
        }
        local_700 = 0;
        local_704 = local_614 + 1;
        local_708 = get_lower_levels_ctx_eob(local_61c,local_620,local_614);
        iVar4 = get_eob_cost((int)((ulong)in_stack_ffffffffffffecb0 >> 0x20),
                             (LV_MAP_EOB_COST *)in_stack_ffffffffffffeca8,
                             (LV_MAP_COEFF_COST *)in_stack_ffffffffffffeca0,
                             in_stack_ffffffffffffec9f);
        uVar2 = (uint)local_616;
        local_70c = iVar4;
        local_710 = get_coeff_cost_eob((int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                                       (tran_low_t)in_stack_ffffffffffffeca8,
                                       (int)((ulong)in_stack_ffffffffffffeca0 >> 0x20),
                                       (int)in_stack_ffffffffffffeca0,
                                       CONCAT13(in_stack_ffffffffffffec9f,
                                                (int3)((uint)in_stack_ffffffffffffec9b >> 8)),
                                       in_stack_ffffffffffffec90,(int)in_stack_ffffffffffffecd0,
                                       (TX_CLASS)in_stack_ffffffffffffecd8);
        iVar3 = local_70c;
        local_710 = iVar4 + local_710;
        local_718 = local_6c8;
        local_720 = ((long)local_710 * (long)local_630 + 0x100 >> 9) + local_6c8 * 0x80;
        if (0 < local_6e4) {
          uVar2 = (uint)local_616;
          local_724 = get_coeff_cost_eob((int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                                         (tran_low_t)in_stack_ffffffffffffeca8,
                                         (int)((ulong)in_stack_ffffffffffffeca0 >> 0x20),
                                         (int)in_stack_ffffffffffffeca0,
                                         CONCAT13(in_stack_ffffffffffffec9f,
                                                  (int3)((uint)in_stack_ffffffffffffec9b >> 8)),
                                         in_stack_ffffffffffffec90,(int)in_stack_ffffffffffffecd0,
                                         (TX_CLASS)in_stack_ffffffffffffecd8);
          local_724 = iVar3 + local_724;
          local_730 = local_6f0;
          local_738 = ((long)local_724 * (long)local_630 + 0x100 >> 9) + local_6f0 * 0x80;
          if (local_738 < local_720) {
            local_700 = 1;
            local_718 = local_6f0;
            local_720 = local_738;
            local_710 = local_724;
          }
        }
        local_73c = 1;
        if (local_614 < 6) {
          local_73c = 2;
        }
        if (local_67c == 0) {
          local_110c = 1;
        }
        else {
          local_110c = (uint)(local_73c < local_6a8);
        }
        local_740 = local_110c;
        if ((local_110c != 0) && (local_6f8 < local_6d8)) {
          local_6a4 = 1;
          local_6d8 = local_6f8;
          local_6cc = local_6fc;
          local_6c8 = local_6f0;
        }
        if (((local_67c == 0) || (4 < (int)local_704)) && (local_720 < local_6d8)) {
          for (local_744 = 0; pLVar12 = local_678, local_744 < *local_608; local_744 = local_744 + 1
              ) {
            local_748 = local_610[local_744];
            iVar3 = get_padded_idx(local_748,local_61c);
            *(uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3) = '\0';
            local_668[local_748] = 0;
            local_670->txb_skip_cost[0][local_748] = 0;
          }
          *local_600 = local_704;
          *local_608 = 0;
          *local_5f0 = local_710;
          *local_5f8 = local_718;
          local_6a4 = local_700;
        }
        else {
          *local_5f0 = local_6cc + *local_5f0;
          *local_5f8 = local_6c8 + *local_5f8;
        }
        pLVar12 = local_678;
        if (local_6a4 != 0) {
          local_668[local_698] = local_6dc;
          local_670->txb_skip_cost[0][local_698] = local_6e0;
          if (local_6e4 < 0x7f) {
            local_111c = (uint8_t)local_6e4;
          }
          else {
            local_111c = '\x7f';
          }
          iVar3 = get_padded_idx(local_698,local_61c);
          *(uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3) = local_111c;
        }
        if (local_668[local_698] != 0) {
          local_610[*local_608] = local_698;
          *local_608 = *local_608 + 1;
        }
      }
    }
  }
  else if (local_a9b == 1) {
    for (; -1 < local_102c && local_1050[3] < 3; local_102c = local_102c + -1) {
      local_770 = local_1050;
      local_784 = in_stack_00000008[1];
      local_750 = &local_1020;
      local_758 = &local_1028;
      local_760 = &local_a50;
      local_768 = local_1050 + 3;
      local_774 = local_102c;
      local_775 = local_a21;
      local_776 = 1;
      local_77c = local_aac;
      local_780 = local_ab0;
      local_790 = local_ae0;
      local_794 = local_a4c;
      local_7a0 = local_a58;
      local_7a8 = local_a48;
      local_7b0 = local_ad0;
      local_7b8 = local_ac0;
      local_7c0 = local_a88;
      local_7c8 = local_a78;
      local_7d0 = local_a80;
      local_7d8 = local_1010;
      local_7dc = in_stack_00000018;
      local_7e8 = local_a60;
      local_7f0 = local_a68;
      local_7f4 = get_dqv((int16_t *)local_a58,
                          (int)*(short *)((long)&local_a48->plane[0].src_diff + (long)local_102c * 2
                                         ),local_a60);
      pLVar12 = local_7d8;
      local_7f8 = (int)*(short *)((long)&local_7a8->plane[0].src_diff + (long)local_774 * 2);
      local_7fc = local_7c8[local_7f8];
      local_308 = local_7d8;
      local_310 = local_77c;
      local_311 = local_775;
      local_312 = local_776;
      local_30c = local_7f8;
      iVar3 = get_padded_idx(local_7f8,local_77c);
      local_2c0 = (uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3);
      local_2c4 = local_310;
      local_2c5 = local_312;
      bVar7 = (byte)local_310;
      iVar3 = (uint)""[local_2c0[1]] + (uint)""[local_2c0[(1 << (bVar7 & 0x1f)) + 4]];
      if (local_312 == 0) {
        local_2cc = (uint)""[local_2c0[2]] +
                    (uint)""[local_2c0[(2 << (bVar7 & 0x1f)) + 8]] +
                    (uint)""[local_2c0[(1 << (bVar7 & 0x1f)) + 5]] + iVar3;
      }
      else if (local_312 == 2) {
        local_2cc = (uint)""[local_2c0[4]] + (uint)""[local_2c0[3]] + (uint)""[local_2c0[2]] + iVar3
        ;
      }
      else {
        local_2cc = (uint)""[local_2c0[(4 << (bVar7 & 0x1f)) + 0x10]] +
                    (uint)""[local_2c0[(3 << (bVar7 & 0x1f)) + 0xc]] +
                    (uint)""[local_2c0[(2 << (bVar7 & 0x1f)) + 8]] + iVar3;
      }
      local_318 = local_2cc;
      local_218 = local_2cc;
      local_21c = local_30c;
      local_220 = local_310;
      local_221 = local_311;
      local_222 = local_312;
      if (local_312 == 0 && local_30c == 0) {
        local_214 = 0;
      }
      else {
        local_115c = local_2cc + 1 >> 1;
        if (3 < local_115c) {
          local_115c = 4;
        }
        local_228 = local_115c;
        if (local_312 == 0) {
          local_214 = local_115c + (int)av1_nz_map_ctx_offset[local_311][local_30c];
        }
        else if (local_312 == 1) {
          local_22c = local_30c >> (bVar7 & 0x1f);
          local_214 = local_115c + nz_map_ctx_offset_1d[local_22c];
        }
        else if (local_312 == 2) {
          local_230 = local_30c >> (bVar7 & 0x1f);
          local_234 = local_30c - (local_230 << (bVar7 & 0x1f));
          local_214 = local_115c + nz_map_ctx_offset_1d[local_234];
        }
        else {
          local_214 = 0;
        }
      }
      local_800 = local_214;
      if (local_7fc == 0) {
        *local_750 = *(int *)(local_7b8 + 0x98 + (long)local_214 * 0x20) + *local_750;
      }
      else {
        local_804 = 0;
        local_808 = local_7fc;
        if (local_7fc < 1) {
          local_808 = -local_7fc;
        }
        local_80c = *(tran_low_t *)(local_7c0 + (long)local_7f8 * 4);
        local_810 = local_7d0->txb_skip_cost[0][local_7f8];
        local_814 = (uint)(local_7fc < 0);
        local_820 = get_coeff_dist(local_80c,0,local_794,local_7f0,local_7f8);
        uVar10 = (undefined4)((ulong)in_stack_ffffffffffffec88 >> 0x20);
        iVar6 = get_coeff_dist(local_80c,local_810,local_794,local_7f0,local_7f8);
        local_828 = iVar6 - local_820;
        in_stack_ffffffffffffec88 = (int *)CONCAT44(uVar10,(uint)local_776);
        in_stack_ffffffffffffec90 = local_7d8;
        local_82c = get_coeff_cost_general
                              ((int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
                               (int)in_stack_ffffffffffffecb8,
                               (tran_low_t)((ulong)in_stack_ffffffffffffecb0 >> 0x20),
                               (int)in_stack_ffffffffffffecb0,
                               (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                               (int)in_stack_ffffffffffffeca8,in_stack_ffffffffffffed10,
                               in_stack_ffffffffffffed18,(TX_CLASS)in_stack_ffffffffffffed20,
                               (uint8_t *)
                               CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
        local_838 = ((long)(*local_750 + local_82c) * (long)local_790 + 0x100 >> 9) +
                    (*local_758 + local_828) * 0x80;
        if (local_808 == 1) {
          local_844 = 0;
          local_83c = 0;
          local_840 = 0;
          local_850 = 0;
          local_85c = *(int *)(local_7b8 + 0x98 + (long)local_800 * 0x20);
          local_858 = ((long)(*local_750 + local_85c) * (long)local_790 + 0x100 >> 9) +
                      *local_758 * 0x80;
        }
        else {
          get_qc_dqc_low(local_808,local_814,local_7f4,local_794,&local_83c,&local_840);
          uVar10 = (undefined4)((ulong)in_stack_ffffffffffffec88 >> 0x20);
          local_844 = local_808 + -1;
          iVar6 = get_coeff_dist(local_80c,local_840,local_794,local_7f0,local_7f8);
          local_850 = iVar6 - local_820;
          in_stack_ffffffffffffec88 = (int *)CONCAT44(uVar10,(uint)local_776);
          in_stack_ffffffffffffec90 = local_7d8;
          local_85c = get_coeff_cost_general
                                ((int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
                                 (int)in_stack_ffffffffffffecb8,
                                 (tran_low_t)((ulong)in_stack_ffffffffffffecb0 >> 0x20),
                                 (int)in_stack_ffffffffffffecb0,
                                 (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                                 (int)in_stack_ffffffffffffeca8,in_stack_ffffffffffffed10,
                                 in_stack_ffffffffffffed18,(TX_CLASS)in_stack_ffffffffffffed20,
                                 (uint8_t *)
                                 CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
          local_858 = ((long)(*local_750 + local_85c) * (long)local_790 + 0x100 >> 9) +
                      (*local_758 + local_850) * 0x80;
        }
        local_860 = 0;
        local_864 = local_774 + 1;
        local_868 = get_lower_levels_ctx_eob(local_77c,local_780,local_774);
        iVar4 = get_eob_cost((int)((ulong)in_stack_ffffffffffffecb0 >> 0x20),
                             (LV_MAP_EOB_COST *)in_stack_ffffffffffffeca8,
                             (LV_MAP_COEFF_COST *)in_stack_ffffffffffffeca0,
                             in_stack_ffffffffffffec9f);
        uVar2 = (uint)local_776;
        local_86c = iVar4;
        local_870 = get_coeff_cost_eob((int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                                       (tran_low_t)in_stack_ffffffffffffeca8,
                                       (int)((ulong)in_stack_ffffffffffffeca0 >> 0x20),
                                       (int)in_stack_ffffffffffffeca0,
                                       CONCAT13(in_stack_ffffffffffffec9f,
                                                (int3)((uint)in_stack_ffffffffffffec9b >> 8)),
                                       in_stack_ffffffffffffec90,(int)in_stack_ffffffffffffecd0,
                                       (TX_CLASS)in_stack_ffffffffffffecd8);
        iVar3 = local_86c;
        local_870 = iVar4 + local_870;
        local_878 = local_828;
        local_880 = ((long)local_870 * (long)local_790 + 0x100 >> 9) + local_828 * 0x80;
        if (0 < local_844) {
          uVar2 = (uint)local_776;
          local_884 = get_coeff_cost_eob((int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                                         (tran_low_t)in_stack_ffffffffffffeca8,
                                         (int)((ulong)in_stack_ffffffffffffeca0 >> 0x20),
                                         (int)in_stack_ffffffffffffeca0,
                                         CONCAT13(in_stack_ffffffffffffec9f,
                                                  (int3)((uint)in_stack_ffffffffffffec9b >> 8)),
                                         in_stack_ffffffffffffec90,(int)in_stack_ffffffffffffecd0,
                                         (TX_CLASS)in_stack_ffffffffffffecd8);
          local_884 = iVar3 + local_884;
          local_890 = local_850;
          local_898 = ((long)local_884 * (long)local_790 + 0x100 >> 9) + local_850 * 0x80;
          if (local_898 < local_880) {
            local_860 = 1;
            local_878 = local_850;
            local_880 = local_898;
            local_870 = local_884;
          }
        }
        local_89c = 1;
        if (local_774 < 6) {
          local_89c = 2;
        }
        if (local_7dc == 0) {
          local_116c = 1;
        }
        else {
          local_116c = (uint)(local_89c < local_808);
        }
        local_8a0 = local_116c;
        if ((local_116c != 0) && (local_858 < local_838)) {
          local_804 = 1;
          local_838 = local_858;
          local_82c = local_85c;
          local_828 = local_850;
        }
        if (((local_7dc == 0) || (4 < (int)local_864)) && (local_880 < local_838)) {
          for (local_8a4 = 0; pLVar12 = local_7d8, local_8a4 < *local_768; local_8a4 = local_8a4 + 1
              ) {
            local_8a8 = local_770[local_8a4];
            iVar3 = get_padded_idx(local_8a8,local_77c);
            *(uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3) = '\0';
            local_7c8[local_8a8] = 0;
            local_7d0->txb_skip_cost[0][local_8a8] = 0;
          }
          *local_760 = local_864;
          *local_768 = 0;
          *local_750 = local_870;
          *local_758 = local_878;
          local_804 = local_860;
        }
        else {
          *local_750 = local_82c + *local_750;
          *local_758 = local_828 + *local_758;
        }
        pLVar12 = local_7d8;
        if (local_804 != 0) {
          local_7c8[local_7f8] = local_83c;
          local_7d0->txb_skip_cost[0][local_7f8] = local_840;
          if (local_844 < 0x7f) {
            local_117c = (uint8_t)local_844;
          }
          else {
            local_117c = '\x7f';
          }
          iVar3 = get_padded_idx(local_7f8,local_77c);
          *(uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3) = local_117c;
        }
        if (local_7c8[local_7f8] != 0) {
          local_770[*local_768] = local_7f8;
          *local_768 = *local_768 + 1;
        }
      }
    }
  }
  else if (local_a9b == 2) {
    for (; -1 < local_102c && local_1050[3] < 3; local_102c = local_102c + -1) {
      local_8d0 = local_1050;
      local_8e4 = in_stack_00000008[1];
      local_8b0 = &local_1020;
      local_8b8 = &local_1028;
      local_8c0 = &local_a50;
      local_8c8 = local_1050 + 3;
      local_8d4 = local_102c;
      local_8d5 = local_a21;
      local_8d6 = 2;
      local_8dc = local_aac;
      local_8e0 = local_ab0;
      local_8f0 = local_ae0;
      local_8f4 = local_a4c;
      local_900 = local_a58;
      local_908 = local_a48;
      local_910 = local_ad0;
      local_918 = local_ac0;
      local_920 = local_a88;
      local_928 = local_a78;
      local_930 = local_a80;
      local_938 = local_1010;
      local_93c = in_stack_00000018;
      local_948 = local_a60;
      local_950 = local_a68;
      local_954 = get_dqv((int16_t *)local_a58,
                          (int)*(short *)((long)&local_a48->plane[0].src_diff + (long)local_102c * 2
                                         ),local_a60);
      pLVar12 = local_938;
      local_958 = (int)*(short *)((long)&local_908->plane[0].src_diff + (long)local_8d4 * 2);
      local_95c = local_928[local_958];
      local_2f0 = local_938;
      local_2f8 = local_8dc;
      local_2f9 = local_8d5;
      local_2fa = local_8d6;
      local_2f4 = local_958;
      iVar3 = get_padded_idx(local_958,local_8dc);
      local_2d8 = (uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3);
      local_2dc = local_2f8;
      local_2dd = local_2fa;
      bVar7 = (byte)local_2f8;
      iVar3 = (uint)""[local_2d8[1]] + (uint)""[local_2d8[(1 << (bVar7 & 0x1f)) + 4]];
      if (local_2fa == 0) {
        local_2e4 = (uint)""[local_2d8[2]] +
                    (uint)""[local_2d8[(2 << (bVar7 & 0x1f)) + 8]] +
                    (uint)""[local_2d8[(1 << (bVar7 & 0x1f)) + 5]] + iVar3;
      }
      else if (local_2fa == 2) {
        local_2e4 = (uint)""[local_2d8[4]] + (uint)""[local_2d8[3]] + (uint)""[local_2d8[2]] + iVar3
        ;
      }
      else {
        local_2e4 = (uint)""[local_2d8[(4 << (bVar7 & 0x1f)) + 0x10]] +
                    (uint)""[local_2d8[(3 << (bVar7 & 0x1f)) + 0xc]] +
                    (uint)""[local_2d8[(2 << (bVar7 & 0x1f)) + 8]] + iVar3;
      }
      local_300 = local_2e4;
      local_23c = local_2e4;
      local_240 = local_2f4;
      local_244 = local_2f8;
      local_245 = local_2f9;
      local_246 = local_2fa;
      if (local_2fa == 0 && local_2f4 == 0) {
        local_238 = 0;
      }
      else {
        local_11bc = local_2e4 + 1 >> 1;
        if (3 < local_11bc) {
          local_11bc = 4;
        }
        local_24c = local_11bc;
        if (local_2fa == 0) {
          local_238 = local_11bc + (int)av1_nz_map_ctx_offset[local_2f9][local_2f4];
        }
        else if (local_2fa == 1) {
          local_250 = local_2f4 >> (bVar7 & 0x1f);
          local_238 = local_11bc + nz_map_ctx_offset_1d[local_250];
        }
        else if (local_2fa == 2) {
          local_254 = local_2f4 >> (bVar7 & 0x1f);
          local_258 = local_2f4 - (local_254 << (bVar7 & 0x1f));
          local_238 = local_11bc + nz_map_ctx_offset_1d[local_258];
        }
        else {
          local_238 = 0;
        }
      }
      local_960 = local_238;
      if (local_95c == 0) {
        *local_8b0 = *(int *)(local_918 + 0x98 + (long)local_238 * 0x20) + *local_8b0;
      }
      else {
        local_964 = 0;
        local_968 = local_95c;
        if (local_95c < 1) {
          local_968 = -local_95c;
        }
        local_96c = *(tran_low_t *)(local_920 + (long)local_958 * 4);
        local_970 = local_930->txb_skip_cost[0][local_958];
        local_974 = (uint)(local_95c < 0);
        local_980 = get_coeff_dist(local_96c,0,local_8f4,local_950,local_958);
        uVar10 = (undefined4)((ulong)in_stack_ffffffffffffec88 >> 0x20);
        iVar6 = get_coeff_dist(local_96c,local_970,local_8f4,local_950,local_958);
        local_988 = iVar6 - local_980;
        in_stack_ffffffffffffec88 = (int *)CONCAT44(uVar10,(uint)local_8d6);
        in_stack_ffffffffffffec90 = local_938;
        local_98c = get_coeff_cost_general
                              ((int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
                               (int)in_stack_ffffffffffffecb8,
                               (tran_low_t)((ulong)in_stack_ffffffffffffecb0 >> 0x20),
                               (int)in_stack_ffffffffffffecb0,
                               (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                               (int)in_stack_ffffffffffffeca8,in_stack_ffffffffffffed10,
                               in_stack_ffffffffffffed18,(TX_CLASS)in_stack_ffffffffffffed20,
                               (uint8_t *)
                               CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
        local_998 = ((long)(*local_8b0 + local_98c) * (long)local_8f0 + 0x100 >> 9) +
                    (*local_8b8 + local_988) * 0x80;
        if (local_968 == 1) {
          local_9a4 = 0;
          local_99c = 0;
          local_9a0 = 0;
          local_9b0 = 0;
          local_9bc = *(int *)(local_918 + 0x98 + (long)local_960 * 0x20);
          local_9b8 = ((long)(*local_8b0 + local_9bc) * (long)local_8f0 + 0x100 >> 9) +
                      *local_8b8 * 0x80;
        }
        else {
          get_qc_dqc_low(local_968,local_974,local_954,local_8f4,&local_99c,&local_9a0);
          uVar10 = (undefined4)((ulong)in_stack_ffffffffffffec88 >> 0x20);
          local_9a4 = local_968 + -1;
          iVar6 = get_coeff_dist(local_96c,local_9a0,local_8f4,local_950,local_958);
          local_9b0 = iVar6 - local_980;
          in_stack_ffffffffffffec88 = (int *)CONCAT44(uVar10,(uint)local_8d6);
          in_stack_ffffffffffffec90 = local_938;
          local_9bc = get_coeff_cost_general
                                ((int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
                                 (int)in_stack_ffffffffffffecb8,
                                 (tran_low_t)((ulong)in_stack_ffffffffffffecb0 >> 0x20),
                                 (int)in_stack_ffffffffffffecb0,
                                 (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                                 (int)in_stack_ffffffffffffeca8,in_stack_ffffffffffffed10,
                                 in_stack_ffffffffffffed18,(TX_CLASS)in_stack_ffffffffffffed20,
                                 (uint8_t *)
                                 CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
          local_9b8 = ((long)(*local_8b0 + local_9bc) * (long)local_8f0 + 0x100 >> 9) +
                      (*local_8b8 + local_9b0) * 0x80;
        }
        local_9c0 = 0;
        local_9c4 = local_8d4 + 1;
        local_9c8 = get_lower_levels_ctx_eob(local_8dc,local_8e0,local_8d4);
        iVar4 = get_eob_cost((int)((ulong)in_stack_ffffffffffffecb0 >> 0x20),
                             (LV_MAP_EOB_COST *)in_stack_ffffffffffffeca8,
                             (LV_MAP_COEFF_COST *)in_stack_ffffffffffffeca0,
                             in_stack_ffffffffffffec9f);
        uVar2 = (uint)local_8d6;
        local_9cc = iVar4;
        local_9d0 = get_coeff_cost_eob((int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                                       (tran_low_t)in_stack_ffffffffffffeca8,
                                       (int)((ulong)in_stack_ffffffffffffeca0 >> 0x20),
                                       (int)in_stack_ffffffffffffeca0,
                                       CONCAT13(in_stack_ffffffffffffec9f,
                                                (int3)((uint)in_stack_ffffffffffffec9b >> 8)),
                                       in_stack_ffffffffffffec90,(int)in_stack_ffffffffffffecd0,
                                       (TX_CLASS)in_stack_ffffffffffffecd8);
        iVar3 = local_9cc;
        local_9d0 = iVar4 + local_9d0;
        local_9d8 = local_988;
        local_9e0 = ((long)local_9d0 * (long)local_8f0 + 0x100 >> 9) + local_988 * 0x80;
        if (0 < local_9a4) {
          uVar2 = (uint)local_8d6;
          local_9e4 = get_coeff_cost_eob((int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                                         (tran_low_t)in_stack_ffffffffffffeca8,
                                         (int)((ulong)in_stack_ffffffffffffeca0 >> 0x20),
                                         (int)in_stack_ffffffffffffeca0,
                                         CONCAT13(in_stack_ffffffffffffec9f,
                                                  (int3)((uint)in_stack_ffffffffffffec9b >> 8)),
                                         in_stack_ffffffffffffec90,(int)in_stack_ffffffffffffecd0,
                                         (TX_CLASS)in_stack_ffffffffffffecd8);
          local_9e4 = iVar3 + local_9e4;
          local_9f0 = local_9b0;
          local_9f8 = ((long)local_9e4 * (long)local_8f0 + 0x100 >> 9) + local_9b0 * 0x80;
          if (local_9f8 < local_9e0) {
            local_9c0 = 1;
            local_9d8 = local_9b0;
            local_9e0 = local_9f8;
            local_9d0 = local_9e4;
          }
        }
        local_9fc = 1;
        if (local_8d4 < 6) {
          local_9fc = 2;
        }
        if (local_93c == 0) {
          local_11cc = 1;
        }
        else {
          local_11cc = (uint)(local_9fc < local_968);
        }
        local_a00 = local_11cc;
        if ((local_11cc != 0) && (local_9b8 < local_998)) {
          local_964 = 1;
          local_998 = local_9b8;
          local_98c = local_9bc;
          local_988 = local_9b0;
        }
        if (((local_93c == 0) || (4 < (int)local_9c4)) && (local_9e0 < local_998)) {
          for (local_a04 = 0; pLVar12 = local_938, local_a04 < *local_8c8; local_a04 = local_a04 + 1
              ) {
            local_a08 = local_8d0[local_a04];
            iVar3 = get_padded_idx(local_a08,local_8dc);
            *(uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3) = '\0';
            local_928[local_a08] = 0;
            local_930->txb_skip_cost[0][local_a08] = 0;
          }
          *local_8c0 = local_9c4;
          *local_8c8 = 0;
          *local_8b0 = local_9d0;
          *local_8b8 = local_9d8;
          local_964 = local_9c0;
        }
        else {
          *local_8b0 = local_98c + *local_8b0;
          *local_8b8 = local_988 + *local_8b8;
        }
        pLVar12 = local_938;
        if (local_964 != 0) {
          local_928[local_958] = local_99c;
          local_930->txb_skip_cost[0][local_958] = local_9a0;
          if (local_9a4 < 0x7f) {
            local_11dc = (uint8_t)local_9a4;
          }
          else {
            local_11dc = '\x7f';
          }
          iVar3 = get_padded_idx(local_958,local_8dc);
          *(uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3) = local_11dc;
        }
        if (local_928[local_958] != 0) {
          local_8d0[*local_8c8] = local_958;
          *local_8c8 = *local_8c8 + 1;
        }
      }
    }
  }
  if (((local_102c == -1) && (local_1050[3] < 3)) && (in_stack_00000018 == 0)) {
    uVar2 = local_1014;
    in_stack_ffffffffffffec88 = local_a78;
    in_stack_ffffffffffffec90 = local_a80;
    update_skip(&local_1020,local_1028,(int *)&local_a50,local_1050[3],local_1050,(int64_t)local_ae0
                ,local_1018,local_1014,local_a78,(tran_low_t *)local_a80);
  }
  shift_00 = (int)in_stack_ffffffffffffed68;
  iVar4 = (int)in_stack_ffffffffffffed58;
  iVar3 = (int)in_stack_ffffffffffffed50;
  uVar13 = (undefined2)((uint)in_stack_ffffffffffffed24 >> 0x10);
  if (local_a9b == 0) {
    while( true ) {
      shift_00 = (int)in_stack_ffffffffffffed68;
      iVar4 = (int)in_stack_ffffffffffffed58;
      iVar3 = (int)in_stack_ffffffffffffed50;
      uVar13 = (undefined2)((uint)in_stack_ffffffffffffed24 >> 0x10);
      if (local_102c < 1) break;
      local_380 = &local_1020;
      local_384 = local_102c;
      local_388 = local_a50;
      local_389 = local_a21;
      local_38a = '\0';
      local_390 = local_aac;
      local_398 = local_ae0;
      local_39c = local_a4c;
      local_3a8 = local_a58;
      local_3b0 = local_a48;
      local_3b8 = local_ac0;
      local_3c0 = local_a88;
      local_3c8 = local_a78;
      local_3d0 = local_a80;
      local_3d8 = local_1010;
      local_3dc = in_stack_00000018;
      local_3e8 = local_a60;
      local_3f0 = local_a68;
      local_3f4 = get_dqv((int16_t *)local_a58,
                          (int)*(short *)((long)&local_a48->plane[0].src_diff + (long)local_102c * 2
                                         ),local_a60);
      pLVar12 = local_3d8;
      local_3f8 = (int)*(short *)((long)&local_3b0->plane[0].src_diff + (long)local_384 * 2);
      local_3fc = local_3c8[local_3f8];
      local_368 = local_3d8;
      local_370 = local_390;
      local_371 = local_389;
      local_372 = local_38a;
      local_36c = local_3f8;
      iVar3 = get_padded_idx(local_3f8,local_390);
      local_260 = (uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3);
      local_264 = local_370;
      local_265 = local_372;
      bVar7 = (byte)local_370;
      iVar3 = (uint)""[local_260[1]] + (uint)""[local_260[(1 << (bVar7 & 0x1f)) + 4]];
      if (local_372 == '\0') {
        local_26c = (uint)""[local_260[2]] +
                    (uint)""[local_260[(2 << (bVar7 & 0x1f)) + 8]] +
                    (uint)""[local_260[(1 << (bVar7 & 0x1f)) + 5]] + iVar3;
      }
      else if (local_372 == '\x02') {
        local_26c = (uint)""[local_260[4]] + (uint)""[local_260[3]] + (uint)""[local_260[2]] + iVar3
        ;
      }
      else {
        local_26c = (uint)""[local_260[(4 << (bVar7 & 0x1f)) + 0x10]] +
                    (uint)""[local_260[(3 << (bVar7 & 0x1f)) + 0xc]] +
                    (uint)""[local_260[(2 << (bVar7 & 0x1f)) + 8]] + iVar3;
      }
      local_378 = local_26c;
      local_188 = local_26c;
      local_18c = local_36c;
      local_190 = local_370;
      local_191 = local_371;
      local_192 = local_372;
      if (local_372 == '\0' && local_36c == 0) {
        local_184 = 0;
      }
      else {
        local_1208 = local_26c + 1 >> 1;
        if (3 < local_1208) {
          local_1208 = 4;
        }
        local_198 = local_1208;
        if (local_372 == '\0') {
          local_184 = local_1208 + (int)av1_nz_map_ctx_offset[local_371][local_36c];
        }
        else if (local_372 == '\x01') {
          local_19c = local_36c >> (bVar7 & 0x1f);
          local_184 = local_1208 + nz_map_ctx_offset_1d[local_19c];
        }
        else if (local_372 == '\x02') {
          local_1a0 = local_36c >> (bVar7 & 0x1f);
          local_1a4 = local_36c - (local_1a0 << (bVar7 & 0x1f));
          local_184 = local_1208 + nz_map_ctx_offset_1d[local_1a4];
        }
        else {
          local_184 = 0;
        }
      }
      local_400 = local_184;
      if (local_3fc == 0) {
        *local_380 = *(int *)(local_3b8 + 0x98 + (long)local_184 * 0x20) + *local_380;
      }
      else {
        local_404 = local_3fc;
        if (local_3fc < 1) {
          local_404 = -local_3fc;
        }
        local_408 = *(int *)(local_3c0 + (long)local_3f8 * 4);
        if (local_408 < 1) {
          local_408 = -local_408;
        }
        local_40c = local_3d0->txb_skip_cost[0][local_3f8];
        if (local_40c < 1) {
          local_40c = -local_40c;
        }
        local_410 = 0;
        local_144 = local_3f8;
        local_14c = local_184;
        local_158 = local_3b8;
        local_15c = local_390;
        local_15d = local_38a;
        local_168 = local_3d8;
        local_170 = &local_410;
        local_121c = local_404;
        if (2 < local_404) {
          local_121c = 3;
        }
        local_174 = *(int *)(local_3b8 + 0x98 + (long)local_184 * 0x20 + (long)local_121c * 4);
        local_178 = 0;
        if (local_404 < 4) {
          local_178 = *(int *)(local_3b8 + 0x98 + (long)local_184 * 0x20 + (long)(local_404 + 4) * 4
                              );
        }
        local_148 = local_404;
        if ((local_404 != 0) && (local_174 = local_174 + 0x200, 2 < local_404)) {
          local_120 = local_3d8;
          local_124 = local_3f8;
          local_128 = local_390;
          iVar3 = local_128;
          local_129 = local_38a;
          local_128._0_1_ = (byte)local_390;
          local_130 = local_3f8 >> ((byte)local_128 & 0x1f);
          local_134 = local_3f8 - (local_130 << ((byte)local_128 & 0x1f));
          local_138 = (1 << ((byte)local_128 & 0x1f)) + 4;
          local_13c = local_130 * local_138 + local_134;
          local_140 = (uint)*(byte *)((long)local_3d8->txb_skip_cost[0] + (long)local_13c + 1) +
                      (uint)*(byte *)((long)local_3d8->txb_skip_cost[0] +
                                     (long)(local_13c + local_138));
          if (local_38a == '\0') {
            local_140 = (uint)*(byte *)((long)local_3d8->txb_skip_cost[0] +
                                       (long)(local_13c + local_138 + 1)) + local_140;
            if ((uint)(local_140 + 1 >> 1) < 6) {
              local_1224 = local_140 + 1 >> 1;
            }
            else {
              local_1224 = 6;
            }
            local_140 = local_1224;
            if (local_3f8 == 0) {
              local_114 = local_1224;
            }
            else {
              if ((1 < local_134) || (1 < local_130)) goto LAB_00349435;
              local_114 = local_1224 + 7;
            }
          }
          else if (local_38a == '\x01') {
            local_140 = (uint)*(byte *)((long)local_3d8->txb_skip_cost[0] +
                                       (long)(local_13c + local_138 * 2)) + local_140;
            if ((uint)(local_140 + 1 >> 1) < 6) {
              local_1228 = local_140 + 1 >> 1;
            }
            else {
              local_1228 = 6;
            }
            local_140 = local_1228;
            if (local_3f8 == 0) {
              local_114 = local_1228;
            }
            else {
              if (local_130 != 0) goto LAB_00349435;
              local_114 = local_1228 + 7;
            }
          }
          else if (local_38a == '\x02') {
            local_140 = (uint)*(byte *)((long)local_3d8->txb_skip_cost[0] + (long)(local_13c + 2)) +
                        local_140;
            if ((uint)(local_140 + 1 >> 1) < 6) {
              local_122c = local_140 + 1 >> 1;
            }
            else {
              local_122c = 6;
            }
            local_140 = local_122c;
            if (local_3f8 == 0) {
              local_114 = local_122c;
            }
            else {
              if (local_134 != 0) goto LAB_00349435;
              local_114 = local_122c + 7;
            }
          }
          else {
LAB_00349435:
            local_114 = local_140 + 0xe;
          }
          local_17c = local_114;
          local_180 = 0;
          local_128 = iVar3;
          iVar3 = get_br_cost_with_diff
                            ((tran_low_t)((ulong)in_stack_ffffffffffffec90 >> 0x20),
                             in_stack_ffffffffffffec88,
                             (int *)CONCAT44(in_stack_ffffffffffffec84,uVar2));
          local_174 = iVar3 + local_174;
          local_178 = local_180 + local_178;
        }
        *local_170 = local_174 - local_178;
        local_414 = local_174;
        if (local_40c < local_408) {
          *local_380 = local_174 + *local_380;
        }
        else {
          local_420 = get_coeff_dist(local_408,local_40c,local_39c,local_3f0,local_3f8);
          local_428 = ((long)local_414 * (long)local_398 + 0x100 >> 9) + local_420 * 0x80;
          local_42c = local_404 - 1;
          local_430 = (int)(local_42c * local_3f4) >> ((byte)local_39c & 0x1f);
          local_438 = get_coeff_dist(local_408,local_430,local_39c,local_3f0,local_3f8);
          pLVar12 = local_3d8;
          local_440 = ((long)local_410 * (long)local_398 + 0x100 >> 9) + local_438 * 0x80;
          if (local_3dc == 0) {
            local_1230 = 1;
          }
          else {
            local_1230 = (uint)(1 < local_404);
          }
          local_444 = local_1230;
          if ((local_440 < local_428) && (local_1230 != 0)) {
            local_448 = (uint)(local_3fc < 0);
            local_3c8[local_3f8] = (-local_448 ^ local_42c) + local_448;
            local_3d0->txb_skip_cost[0][local_3f8] = (-local_448 ^ local_430) + local_448;
            if ((int)local_42c < 0x7f) {
              local_1234 = (uint8_t)local_42c;
            }
            else {
              local_1234 = '\x7f';
            }
            iVar3 = get_padded_idx(local_3f8,local_390);
            *(uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3) = local_1234;
            *local_380 = local_410 + *local_380;
          }
          else {
            *local_380 = local_414 + *local_380;
          }
        }
      }
      local_102c = local_102c + -1;
    }
  }
  else if (local_a9b == 1) {
    while( true ) {
      shift_00 = (int)in_stack_ffffffffffffed68;
      iVar4 = (int)in_stack_ffffffffffffed58;
      iVar3 = (int)in_stack_ffffffffffffed50;
      uVar13 = (undefined2)((uint)in_stack_ffffffffffffed24 >> 0x10);
      if (local_102c < 1) break;
      local_450 = &local_1020;
      local_454 = local_102c;
      local_458 = local_a50;
      local_459 = local_a21;
      local_45a = 1;
      local_460 = local_aac;
      local_468 = local_ae0;
      local_46c = local_a4c;
      local_478 = local_a58;
      local_480 = local_a48;
      local_488 = local_ac0;
      local_490 = local_a88;
      local_498 = local_a78;
      local_4a0 = local_a80;
      local_4a8 = local_1010;
      local_4ac = in_stack_00000018;
      local_4b8 = local_a60;
      local_4c0 = local_a68;
      in_stack_ffffffffffffeda4 = local_102c;
      in_stack_ffffffffffffeda8 = local_a68;
      local_4c4 = get_dqv((int16_t *)local_a58,
                          (int)*(short *)((long)&local_a48->plane[0].src_diff + (long)local_102c * 2
                                         ),local_a60);
      local_4c8 = (int)*(short *)((long)&local_480->plane[0].src_diff + (long)local_454 * 2);
      local_4cc = local_498[local_4c8];
      local_350 = local_4a8;
      local_358 = local_460;
      local_359 = local_459;
      local_35a = local_45a;
      in_stack_ffffffffffffedb0 = local_4a8;
      local_354 = local_4c8;
      iVar3 = get_padded_idx(local_4c8,local_460);
      local_278 = (uint8_t *)((long)in_stack_ffffffffffffedb0->txb_skip_cost[0] + (long)iVar3);
      local_27c = local_358;
      local_27d = local_35a;
      bVar7 = (byte)local_358;
      iVar3 = (uint)""[local_278[1]] + (uint)""[local_278[(1 << (bVar7 & 0x1f)) + 4]];
      if (local_35a == 0) {
        local_284 = (uint)""[local_278[2]] +
                    (uint)""[local_278[(2 << (bVar7 & 0x1f)) + 8]] +
                    (uint)""[local_278[(1 << (bVar7 & 0x1f)) + 5]] + iVar3;
      }
      else if (local_35a == 2) {
        local_284 = (uint)""[local_278[4]] + (uint)""[local_278[3]] + (uint)""[local_278[2]] + iVar3
        ;
      }
      else {
        local_284 = (uint)""[local_278[(4 << (bVar7 & 0x1f)) + 0x10]] +
                    (uint)""[local_278[(3 << (bVar7 & 0x1f)) + 0xc]] +
                    (uint)""[local_278[(2 << (bVar7 & 0x1f)) + 8]] + iVar3;
      }
      local_360 = local_284;
      local_1ac = local_284;
      local_1b0 = local_354;
      local_1b4 = local_358;
      local_1b5 = local_359;
      local_1b6 = local_35a;
      if (local_35a == 0 && local_354 == 0) {
        local_1a8 = 0;
      }
      else {
        in_stack_ffffffffffffeda0 = local_284 + 1 >> 1;
        if (3 < in_stack_ffffffffffffeda0) {
          in_stack_ffffffffffffeda0 = 4;
        }
        in_stack_ffffffffffffed9c = (uint)local_35a;
        local_1bc = in_stack_ffffffffffffeda0;
        if (in_stack_ffffffffffffed9c == 0) {
          local_1a8 = in_stack_ffffffffffffeda0 + (int)av1_nz_map_ctx_offset[local_359][local_354];
        }
        else if (in_stack_ffffffffffffed9c == 1) {
          local_1c0 = local_354 >> (bVar7 & 0x1f);
          local_1a8 = in_stack_ffffffffffffeda0 + nz_map_ctx_offset_1d[local_1c0];
        }
        else if (in_stack_ffffffffffffed9c == 2) {
          local_1c4 = local_354 >> (bVar7 & 0x1f);
          local_1c8 = local_354 - (local_1c4 << (bVar7 & 0x1f));
          local_1a8 = in_stack_ffffffffffffeda0 + nz_map_ctx_offset_1d[local_1c8];
        }
        else {
          local_1a8 = 0;
        }
      }
      local_4d0 = local_1a8;
      if (local_4cc == 0) {
        *local_450 = *(int *)(local_488 + 0x98 + (long)local_1a8 * 0x20) + *local_450;
      }
      else {
        local_4d4 = local_4cc;
        if (local_4cc < 1) {
          local_4d4 = -local_4cc;
        }
        local_4d8 = *(int *)(local_490 + (long)local_4c8 * 4);
        if (local_4d8 < 1) {
          local_4d8 = -local_4d8;
        }
        local_4dc = local_4a0->txb_skip_cost[0][local_4c8];
        if (local_4dc < 1) {
          local_4dc = -local_4dc;
        }
        local_4e0 = 0;
        local_d4 = local_4c8;
        local_dc = local_1a8;
        local_e8 = local_488;
        local_ec = local_460;
        local_ed = local_45a;
        local_f8 = local_4a8;
        local_100 = &local_4e0;
        in_stack_ffffffffffffed90 = (tran_low_t *)(local_488 + 0x98 + (long)local_1a8 * 0x20);
        in_stack_ffffffffffffed8c = local_4d4;
        if (2 < local_4d4) {
          in_stack_ffffffffffffed8c = 3;
        }
        local_104 = in_stack_ffffffffffffed90[in_stack_ffffffffffffed8c];
        local_108 = 0;
        if (local_4d4 < 4) {
          local_108 = *(int *)(local_488 + 0x98 + (long)local_1a8 * 0x20 + (long)(local_4d4 + 4) * 4
                              );
        }
        local_d8 = local_4d4;
        if ((local_4d4 != 0) && (local_104 = local_104 + 0x200, 2 < local_4d4)) {
          local_b0 = local_4a8;
          local_b4 = local_4c8;
          local_b8 = local_460;
          iVar3 = local_b8;
          local_b9 = local_45a;
          local_b8._0_1_ = (byte)local_460;
          local_c0 = local_4c8 >> ((byte)local_b8 & 0x1f);
          local_c4 = local_4c8 - (local_c0 << ((byte)local_b8 & 0x1f));
          local_c8 = (1 << ((byte)local_b8 & 0x1f)) + 4;
          local_cc = local_c0 * local_c8 + local_c4;
          local_d0 = (uint)*(byte *)((long)local_4a8->txb_skip_cost[0] + (long)local_cc + 1) +
                     (uint)*(byte *)((long)local_4a8->txb_skip_cost[0] + (long)(local_cc + local_c8)
                                    );
          in_stack_ffffffffffffed88 = (uint)local_45a;
          if (in_stack_ffffffffffffed88 == 0) {
            local_d0 = (uint)*(byte *)((long)local_4a8->txb_skip_cost[0] +
                                      (long)(local_cc + local_c8 + 1)) + local_d0;
            if ((uint)(local_d0 + 1 >> 1) < 6) {
              in_stack_ffffffffffffed84 = local_d0 + 1 >> 1;
            }
            else {
              in_stack_ffffffffffffed84 = 6;
            }
            local_d0 = in_stack_ffffffffffffed84;
            local_a4 = in_stack_ffffffffffffed84;
            if (local_4c8 != 0) {
              if ((1 < local_c4) || (1 < local_c0)) goto LAB_0034a332;
              local_a4 = in_stack_ffffffffffffed84 + 7;
            }
          }
          else if (in_stack_ffffffffffffed88 == 1) {
            local_d0 = (uint)*(byte *)((long)local_4a8->txb_skip_cost[0] +
                                      (long)(local_cc + local_c8 * 2)) + local_d0;
            if ((uint)(local_d0 + 1 >> 1) < 6) {
              in_stack_ffffffffffffed80 = local_d0 + 1 >> 1;
            }
            else {
              in_stack_ffffffffffffed80 = 6;
            }
            local_d0 = in_stack_ffffffffffffed80;
            local_a4 = in_stack_ffffffffffffed80;
            if (local_4c8 != 0) {
              if (local_c0 != 0) goto LAB_0034a332;
              local_a4 = in_stack_ffffffffffffed80 + 7;
            }
          }
          else if (in_stack_ffffffffffffed88 == 2) {
            local_d0 = (uint)*(byte *)((long)local_4a8->txb_skip_cost[0] + (long)(local_cc + 2)) +
                       local_d0;
            if ((uint)(local_d0 + 1 >> 1) < 6) {
              in_stack_ffffffffffffed7c = local_d0 + 1 >> 1;
            }
            else {
              in_stack_ffffffffffffed7c = 6;
            }
            local_d0 = in_stack_ffffffffffffed7c;
            local_a4 = in_stack_ffffffffffffed7c;
            if (local_4c8 != 0) {
              if (local_c4 != 0) goto LAB_0034a332;
              local_a4 = in_stack_ffffffffffffed7c + 7;
            }
          }
          else {
LAB_0034a332:
            local_a4 = local_d0 + 0xe;
          }
          local_10c = local_a4;
          local_110 = 0;
          local_b8 = iVar3;
          iVar3 = get_br_cost_with_diff
                            ((tran_low_t)((ulong)in_stack_ffffffffffffec90 >> 0x20),
                             in_stack_ffffffffffffec88,
                             (int *)CONCAT44(in_stack_ffffffffffffec84,uVar2));
          local_104 = iVar3 + local_104;
          local_108 = local_110 + local_108;
        }
        *local_100 = local_104 - local_108;
        local_4e4 = local_104;
        if (local_4dc < local_4d8) {
          *local_450 = local_104 + *local_450;
        }
        else {
          local_4f0 = get_coeff_dist(local_4d8,local_4dc,local_46c,local_4c0,local_4c8);
          local_4f8 = ((long)local_4e4 * (long)local_468 + 0x100 >> 9) + local_4f0 * 0x80;
          local_4fc = local_4d4 - 1;
          local_500 = (int)(local_4fc * local_4c4) >> ((byte)local_46c & 0x1f);
          local_508 = get_coeff_dist(local_4d8,local_500,local_46c,local_4c0,local_4c8);
          local_510 = ((long)local_4e0 * (long)local_468 + 0x100 >> 9) + local_508 * 0x80;
          if (local_4ac == 0) {
            in_stack_ffffffffffffed78 = 1;
          }
          else {
            in_stack_ffffffffffffed78 = (uint)(1 < local_4d4);
          }
          local_514 = in_stack_ffffffffffffed78;
          if ((local_510 < local_4f8) && (in_stack_ffffffffffffed78 != 0)) {
            local_518 = (uint)(local_4cc < 0);
            local_498[local_4c8] = (-local_518 ^ local_4fc) + local_518;
            local_4a0->txb_skip_cost[0][local_4c8] = (-local_518 ^ local_500) + local_518;
            if ((int)local_4fc < 0x7f) {
              local_128c = (uint8_t)local_4fc;
            }
            else {
              local_128c = '\x7f';
            }
            in_stack_ffffffffffffed68 = local_4a8;
            iVar3 = get_padded_idx(local_4c8,local_460);
            *(uint8_t *)((long)in_stack_ffffffffffffed68->txb_skip_cost[0] + (long)iVar3) =
                 local_128c;
            *local_450 = local_4e0 + *local_450;
          }
          else {
            *local_450 = local_4e4 + *local_450;
          }
        }
      }
      local_102c = local_102c + -1;
    }
  }
  else if (local_a9b == 2) {
    while( true ) {
      shift_00 = (int)in_stack_ffffffffffffed68;
      iVar4 = (int)in_stack_ffffffffffffed58;
      iVar3 = (int)in_stack_ffffffffffffed50;
      uVar13 = (undefined2)((uint)in_stack_ffffffffffffed24 >> 0x10);
      if (local_102c < 1) break;
      local_520 = &local_1020;
      local_524 = local_102c;
      local_528 = local_a50;
      local_529 = local_a21;
      local_52a = 2;
      local_530 = local_aac;
      local_538 = local_ae0;
      local_53c = local_a4c;
      local_548 = local_a58;
      local_550 = local_a48;
      local_558 = local_ac0;
      local_560 = local_a88;
      local_568 = local_a78;
      local_570 = local_a80;
      local_578 = local_1010;
      local_57c = in_stack_00000018;
      local_588 = local_a60;
      local_590 = local_a68;
      in_stack_ffffffffffffed50 = local_a68;
      local_594 = get_dqv((int16_t *)local_a58,
                          (int)*(short *)((long)&local_a48->plane[0].src_diff + (long)local_102c * 2
                                         ),local_a60);
      local_598 = (int)*(short *)((long)&local_550->plane[0].src_diff + (long)local_524 * 2);
      local_59c = local_568[local_598];
      local_338 = local_578;
      local_340 = local_530;
      local_341 = local_529;
      local_342 = local_52a;
      in_stack_ffffffffffffed58 = local_578;
      local_33c = local_598;
      iVar3 = get_padded_idx(local_598,local_530);
      local_290 = (uint8_t *)((long)in_stack_ffffffffffffed58->txb_skip_cost[0] + (long)iVar3);
      local_294 = local_340;
      local_295 = local_342;
      bVar7 = (byte)local_340;
      iVar3 = (uint)""[local_290[1]] + (uint)""[local_290[(1 << (bVar7 & 0x1f)) + 4]];
      if (local_342 == 0) {
        local_29c = (uint)""[local_290[2]] +
                    (uint)""[local_290[(2 << (bVar7 & 0x1f)) + 8]] +
                    (uint)""[local_290[(1 << (bVar7 & 0x1f)) + 5]] + iVar3;
      }
      else if (local_342 == 2) {
        local_29c = (uint)""[local_290[4]] + (uint)""[local_290[3]] + (uint)""[local_290[2]] + iVar3
        ;
      }
      else {
        local_29c = (uint)""[local_290[(4 << (bVar7 & 0x1f)) + 0x10]] +
                    (uint)""[local_290[(3 << (bVar7 & 0x1f)) + 0xc]] +
                    (uint)""[local_290[(2 << (bVar7 & 0x1f)) + 8]] + iVar3;
      }
      local_348 = local_29c;
      local_1d0 = local_29c;
      local_1d4 = local_33c;
      local_1d8 = local_340;
      local_1d9 = local_341;
      local_1da = local_342;
      if (local_342 == 0 && local_33c == 0) {
        local_1cc = 0;
      }
      else {
        local_12b8 = local_29c + 1 >> 1;
        if (3 < local_12b8) {
          local_12b8 = 4;
        }
        local_1e0 = local_12b8;
        if (local_342 == 0) {
          local_1cc = local_12b8 + (int)av1_nz_map_ctx_offset[local_341][local_33c];
        }
        else if (local_342 == 1) {
          local_1e4 = local_33c >> (bVar7 & 0x1f);
          local_1cc = local_12b8 + nz_map_ctx_offset_1d[local_1e4];
        }
        else if (local_342 == 2) {
          local_1e8 = local_33c >> (bVar7 & 0x1f);
          local_1ec = local_33c - (local_1e8 << (bVar7 & 0x1f));
          local_1cc = local_12b8 + nz_map_ctx_offset_1d[local_1ec];
        }
        else {
          local_1cc = 0;
        }
      }
      local_5a0 = local_1cc;
      if (local_59c == 0) {
        *local_520 = *(int *)(local_558 + 0x98 + (long)local_1cc * 0x20) + *local_520;
      }
      else {
        local_5a4 = local_59c;
        if (local_59c < 1) {
          local_5a4 = -local_59c;
        }
        local_5a8 = *(int *)(local_560 + (long)local_598 * 4);
        if (local_5a8 < 1) {
          local_5a8 = -local_5a8;
        }
        local_5ac = local_570->txb_skip_cost[0][local_598];
        if (local_5ac < 1) {
          local_5ac = -local_5ac;
        }
        local_5b0 = 0;
        local_64 = local_598;
        local_6c = local_1cc;
        local_78 = local_558;
        local_7c = local_530;
        local_7d = local_52a;
        local_88 = local_578;
        local_90 = &local_5b0;
        in_stack_ffffffffffffed38 = (int *)(local_558 + 0x98 + (long)local_1cc * 0x20);
        in_stack_ffffffffffffed34 = local_5a4;
        if (2 < local_5a4) {
          in_stack_ffffffffffffed34 = 3;
        }
        local_94 = in_stack_ffffffffffffed38[in_stack_ffffffffffffed34];
        local_98 = 0;
        if (local_5a4 < 4) {
          local_98 = *(int *)(local_558 + 0x98 + (long)local_1cc * 0x20 + (long)(local_5a4 + 4) * 4)
          ;
        }
        local_68 = local_5a4;
        if ((local_5a4 != 0) && (local_94 = local_94 + 0x200, 2 < local_5a4)) {
          local_40 = local_578;
          local_44 = local_598;
          local_48 = local_530;
          iVar3 = local_48;
          local_49 = local_52a;
          local_48._0_1_ = (byte)local_530;
          local_50 = local_598 >> ((byte)local_48 & 0x1f);
          local_54 = local_598 - (local_50 << ((byte)local_48 & 0x1f));
          local_58 = (1 << ((byte)local_48 & 0x1f)) + 4;
          local_5c = local_50 * local_58 + local_54;
          local_60 = (uint)*(byte *)((long)local_578->txb_skip_cost[0] + (long)local_5c + 1) +
                     (uint)*(byte *)((long)local_578->txb_skip_cost[0] + (long)(local_5c + local_58)
                                    );
          in_stack_ffffffffffffed30 = (uint)local_52a;
          if (in_stack_ffffffffffffed30 == 0) {
            local_60 = (uint)*(byte *)((long)local_578->txb_skip_cost[0] +
                                      (long)(local_5c + local_58 + 1)) + local_60;
            if ((uint)(local_60 + 1 >> 1) < 6) {
              in_stack_ffffffffffffed2c = local_60 + 1 >> 1;
            }
            else {
              in_stack_ffffffffffffed2c = 6;
            }
            local_60 = in_stack_ffffffffffffed2c;
            local_34 = in_stack_ffffffffffffed2c;
            if (local_598 != 0) {
              if ((1 < local_54) || (1 < local_50)) goto LAB_0034b22f;
              local_34 = in_stack_ffffffffffffed2c + 7;
            }
          }
          else if (in_stack_ffffffffffffed30 == 1) {
            local_60 = (uint)*(byte *)((long)local_578->txb_skip_cost[0] +
                                      (long)(local_5c + local_58 * 2)) + local_60;
            if ((uint)(local_60 + 1 >> 1) < 6) {
              in_stack_ffffffffffffed28 = local_60 + 1 >> 1;
            }
            else {
              in_stack_ffffffffffffed28 = 6;
            }
            local_60 = in_stack_ffffffffffffed28;
            local_34 = in_stack_ffffffffffffed28;
            if (local_598 != 0) {
              if (local_50 != 0) goto LAB_0034b22f;
              local_34 = in_stack_ffffffffffffed28 + 7;
            }
          }
          else if (in_stack_ffffffffffffed30 == 2) {
            local_60 = (uint)*(byte *)((long)local_578->txb_skip_cost[0] + (long)(local_5c + 2)) +
                       local_60;
            if ((uint)(local_60 + 1 >> 1) < 6) {
              in_stack_ffffffffffffed24 = local_60 + 1 >> 1;
            }
            else {
              in_stack_ffffffffffffed24 = 6;
            }
            local_60 = in_stack_ffffffffffffed24;
            local_34 = in_stack_ffffffffffffed24;
            if (local_598 != 0) {
              if (local_54 != 0) goto LAB_0034b22f;
              local_34 = in_stack_ffffffffffffed24 + 7;
            }
          }
          else {
LAB_0034b22f:
            local_34 = local_60 + 0xe;
          }
          local_9c = local_34;
          local_a0 = 0;
          local_48 = iVar3;
          iVar3 = get_br_cost_with_diff
                            ((tran_low_t)((ulong)in_stack_ffffffffffffec90 >> 0x20),
                             in_stack_ffffffffffffec88,
                             (int *)CONCAT44(in_stack_ffffffffffffec84,uVar2));
          local_94 = iVar3 + local_94;
          local_98 = local_a0 + local_98;
        }
        *local_90 = local_94 - local_98;
        local_5b4 = local_94;
        if (local_5ac < local_5a8) {
          *local_520 = local_94 + *local_520;
        }
        else {
          local_5c0 = get_coeff_dist(local_5a8,local_5ac,local_53c,local_590,local_598);
          local_5c8 = ((long)local_5b4 * (long)local_538 + 0x100 >> 9) + local_5c0 * 0x80;
          local_5cc = local_5a4 - 1;
          local_5d0 = (int)(local_5cc * local_594) >> ((byte)local_53c & 0x1f);
          local_5d8 = get_coeff_dist(local_5a8,local_5d0,local_53c,local_590,local_598);
          local_5e0 = ((long)local_5b0 * (long)local_538 + 0x100 >> 9) + local_5d8 * 0x80;
          if (local_57c == 0) {
            local_5e4 = 1;
          }
          else {
            local_5e4 = (uint)(1 < local_5a4);
          }
          if ((local_5e0 < local_5c8) && (local_5e4 != 0)) {
            local_5e8 = (uint)(local_59c < 0);
            local_568[local_598] = (-local_5e8 ^ local_5cc) + local_5e8;
            local_570->txb_skip_cost[0][local_598] = (-local_5e8 ^ local_5d0) + local_5e8;
            if ((int)local_5cc < 0x7f) {
              local_12e4 = (uint8_t)local_5cc;
            }
            else {
              local_12e4 = '\x7f';
            }
            pLVar12 = local_578;
            iVar3 = get_padded_idx(local_598,local_530);
            *(uint8_t *)((long)pLVar12->txb_skip_cost[0] + (long)iVar3) = local_12e4;
            *local_520 = local_5b0 + *local_520;
          }
          else {
            *local_520 = local_5b4 + *local_520;
          }
        }
      }
      local_102c = local_102c + -1;
    }
  }
  iVar11 = (int)((ulong)in_stack_ffffffffffffec88 >> 0x20);
  if (local_102c == 0) {
    iVar11 = in_stack_00000008[1];
    in_stack_ffffffffffffec90 =
         (LV_MAP_COEFF_COST *)CONCAT44((int)((ulong)in_stack_ffffffffffffec90 >> 0x20),local_a4c);
    in_stack_ffffffffffffec98 = (undefined2)iVar11;
    in_stack_ffffffffffffec9a = (TX_TYPE)((uint)iVar11 >> 0x10);
    in_stack_ffffffffffffec9b =
         CONCAT31((int3)((uint)in_stack_ffffffffffffec9b >> 8),(char)((uint)iVar11 >> 0x18));
    piVar9 = local_ae0;
    in_stack_ffffffffffffeca0 = local_a58;
    in_stack_ffffffffffffeca8 = local_a48;
    update_coeff_general
              (in_stack_ffffffffffffed38,
               (int64_t *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
               in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28,(TX_SIZE)((ushort)uVar13 >> 8),
               (TX_CLASS)uVar13,iVar3,iVar4,CONCAT17(local_128c,in_stack_ffffffffffffed60),shift_00,
               in_stack_ffffffffffffed70,
               (int16_t *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
               (int16_t *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
               (LV_MAP_COEFF_COST *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88),
               in_stack_ffffffffffffed90,
               (tran_low_t *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98),
               (tran_low_t *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
               in_stack_ffffffffffffeda8,(qm_val_t *)in_stack_ffffffffffffedb0,
               (qm_val_t *)CONCAT17(local_1234,in_stack_ffffffffffffedb8));
    iVar11 = (int)((ulong)piVar9 >> 0x20);
  }
  iVar4 = get_tx_type_cost(in_stack_ffffffffffffeca8,(MACROBLOCKD *)in_stack_ffffffffffffeca0,
                           CONCAT13(in_stack_ffffffffffffec9f,
                                    (int3)((uint)in_stack_ffffffffffffec9b >> 8)),
                           (TX_SIZE)in_stack_ffffffffffffec9b,in_stack_ffffffffffffec9a,
                           (int)((ulong)in_stack_ffffffffffffec90 >> 0x20));
  iVar3 = local_1018;
  if (local_a50 != 0) {
    iVar3 = local_1014 + iVar4;
  }
  local_1020 = iVar3 + local_1020;
  *(short *)(*(long *)(local_a38 + 0x20) + (long)local_a20 * 2) = (short)local_a50;
  uVar1 = av1_get_txb_entropy_context
                    ((tran_low_t *)
                     CONCAT17(in_stack_ffffffffffffec9f,
                              CONCAT43(in_stack_ffffffffffffec9b,
                                       CONCAT12(in_stack_ffffffffffffec9a,in_stack_ffffffffffffec98)
                                      )),(SCAN_ORDER *)in_stack_ffffffffffffec90,iVar11);
  *(uint8_t *)(*(long *)(local_a38 + 0x28) + (long)local_a20) = uVar1;
  *in_stack_00000010 = local_1020;
  return local_a50;
}

Assistant:

int av1_optimize_txb(const struct AV1_COMP *cpi, MACROBLOCK *x, int plane,
                     int block, TX_SIZE tx_size, TX_TYPE tx_type,
                     const TXB_CTX *const txb_ctx, int *rate_cost,
                     int sharpness) {
  MACROBLOCKD *xd = &x->e_mbd;
  const struct macroblock_plane *p = &x->plane[plane];
  const SCAN_ORDER *scan_order = get_scan(tx_size, tx_type);
  const int16_t *scan = scan_order->scan;
  const int shift = av1_get_tx_scale(tx_size);
  int eob = p->eobs[block];
  const int16_t *dequant = p->dequant_QTX;
  const qm_val_t *iqmatrix =
      av1_get_iqmatrix(&cpi->common.quant_params, xd, plane, tx_size, tx_type);
  const qm_val_t *qmatrix =
      cpi->oxcf.tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR
          ? av1_get_qmatrix(&cpi->common.quant_params, xd, plane, tx_size,
                            tx_type)
          : NULL;
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *qcoeff = p->qcoeff + block_offset;
  tran_low_t *dqcoeff = p->dqcoeff + block_offset;
  const tran_low_t *tcoeff = p->coeff + block_offset;
  const CoeffCosts *coeff_costs = &x->coeff_costs;

  // This function is not called if eob = 0.
  assert(eob > 0);

  const AV1_COMMON *cm = &cpi->common;
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const TX_CLASS tx_class = tx_type_to_class[tx_type];
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int bhl = get_txb_bhl(tx_size);
  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  assert(height == (1 << bhl));
  const int is_inter = is_inter_block(mbmi);
  const LV_MAP_COEFF_COST *txb_costs =
      &coeff_costs->coeff_costs[txs_ctx][plane_type];
  const int eob_multi_size = txsize_log2_minus4[tx_size];
  const LV_MAP_EOB_COST *txb_eob_costs =
      &coeff_costs->eob_costs[eob_multi_size][plane_type];

  // For the IQ and SSIMULACRA 2 tunings, increase rshift from 2 to 4.
  // This biases trellis quantization towards keeping more coefficients, and
  // together with the IQ and SSIMULACRA2 rdmult adjustment in
  // av1_compute_rd_mult_based_on_qindex(), this helps preserve image
  // features (like repeating patterns and camera noise/film grain), which
  // improves SSIMULACRA 2 scores.
  const int rshift = (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_IQ ||
                      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIMULACRA2)
                         ? 7
                         : 5;

  const int64_t rdmult = ROUND_POWER_OF_TWO(
      (int64_t)x->rdmult * (8 - sharpness) *
          (plane_rd_mult[is_inter][plane_type] << (2 * (xd->bd - 8))),
      rshift);

  uint8_t levels_buf[TX_PAD_2D];
  uint8_t *const levels = set_levels(levels_buf, height);

  if (eob > 1) av1_txb_init_levels(qcoeff, width, height, levels);

  // TODO(angirbird): check iqmatrix

  const int non_skip_cost = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
  const int skip_cost = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  const int eob_cost = get_eob_cost(eob, txb_eob_costs, txb_costs, tx_class);
  int accu_rate = eob_cost;
  int64_t accu_dist = 0;
  int si = eob - 1;
  const int ci = scan[si];
  const tran_low_t qc = qcoeff[ci];
  const tran_low_t abs_qc = abs(qc);
  const int sign = qc < 0;
  const int max_nz_num = 2;
  int nz_num = 1;
  int nz_ci[3] = { ci, 0, 0 };
  if (abs_qc >= 2) {
    update_coeff_general(&accu_rate, &accu_dist, si, eob, tx_size, tx_class,
                         bhl, width, rdmult, shift, txb_ctx->dc_sign_ctx,
                         dequant, scan, txb_costs, tcoeff, qcoeff, dqcoeff,
                         levels, iqmatrix, qmatrix);
    --si;
  } else {
    assert(abs_qc == 1);
    const int coeff_ctx = get_lower_levels_ctx_eob(bhl, width, si);
    accu_rate +=
        get_coeff_cost_eob(ci, abs_qc, sign, coeff_ctx, txb_ctx->dc_sign_ctx,
                           txb_costs, bhl, tx_class);
    const tran_low_t tqc = tcoeff[ci];
    const tran_low_t dqc = dqcoeff[ci];
    const int64_t dist = get_coeff_dist(tqc, dqc, shift, qmatrix, ci);
    const int64_t dist0 = get_coeff_dist(tqc, 0, shift, qmatrix, ci);
    accu_dist += dist - dist0;
    --si;
  }

#define UPDATE_COEFF_EOB_CASE(tx_class_literal)                            \
  case tx_class_literal:                                                   \
    for (; si >= 0 && nz_num <= max_nz_num; --si) {                        \
      update_coeff_eob(&accu_rate, &accu_dist, &eob, &nz_num, nz_ci, si,   \
                       tx_size, tx_class_literal, bhl, width,              \
                       txb_ctx->dc_sign_ctx, rdmult, shift, dequant, scan, \
                       txb_eob_costs, txb_costs, tcoeff, qcoeff, dqcoeff,  \
                       levels, sharpness, iqmatrix, qmatrix);              \
    }                                                                      \
    break
  switch (tx_class) {
    UPDATE_COEFF_EOB_CASE(TX_CLASS_2D);
    UPDATE_COEFF_EOB_CASE(TX_CLASS_HORIZ);
    UPDATE_COEFF_EOB_CASE(TX_CLASS_VERT);
#undef UPDATE_COEFF_EOB_CASE
    default: assert(false);
  }

  if (si == -1 && nz_num <= max_nz_num && sharpness == 0) {
    update_skip(&accu_rate, accu_dist, &eob, nz_num, nz_ci, rdmult, skip_cost,
                non_skip_cost, qcoeff, dqcoeff);
  }

#define UPDATE_COEFF_SIMPLE_CASE(tx_class_literal)                             \
  case tx_class_literal:                                                       \
    for (; si >= 1; --si) {                                                    \
      update_coeff_simple(&accu_rate, si, eob, tx_size, tx_class_literal, bhl, \
                          rdmult, shift, dequant, scan, txb_costs, tcoeff,     \
                          qcoeff, dqcoeff, levels, sharpness, iqmatrix,        \
                          qmatrix);                                            \
    }                                                                          \
    break
  switch (tx_class) {
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_2D);
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_HORIZ);
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_VERT);
#undef UPDATE_COEFF_SIMPLE_CASE
    default: assert(false);
  }

  // DC position
  if (si == 0) {
    // no need to update accu_dist because it's not used after this point
    int64_t dummy_dist = 0;
    update_coeff_general(&accu_rate, &dummy_dist, si, eob, tx_size, tx_class,
                         bhl, width, rdmult, shift, txb_ctx->dc_sign_ctx,
                         dequant, scan, txb_costs, tcoeff, qcoeff, dqcoeff,
                         levels, iqmatrix, qmatrix);
  }

  const int tx_type_cost = get_tx_type_cost(x, xd, plane, tx_size, tx_type,
                                            cm->features.reduced_tx_set_used);
  if (eob == 0)
    accu_rate += skip_cost;
  else
    accu_rate += non_skip_cost + tx_type_cost;

  p->eobs[block] = eob;
  p->txb_entropy_ctx[block] =
      av1_get_txb_entropy_context(qcoeff, scan_order, p->eobs[block]);

  *rate_cost = accu_rate;
  return eob;
}